

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block_simd.h
# Opt level: O1

void cdef_filter_16_2_sse4_1
               (void *dest,int dstride,uint16_t *in,int pri_strength,int sec_strength,int dir,
               int pri_damping,int sec_damping,int coeff_shift,int block_width,int block_height)

{
  undefined1 (*pauVar1) [16];
  short *psVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  int iVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [14];
  long lVar14;
  long lVar15;
  uint uVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  short sVar22;
  undefined4 uVar23;
  short sVar37;
  short sVar39;
  short sVar41;
  short sVar43;
  short sVar45;
  undefined1 auVar25 [16];
  undefined4 uVar24;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  short sVar35;
  short sVar47;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  short sVar48;
  short sVar49;
  short sVar51;
  short sVar52;
  short sVar53;
  short sVar54;
  short sVar55;
  short sVar56;
  short sVar57;
  short sVar58;
  short sVar59;
  short sVar60;
  short sVar61;
  short sVar62;
  short sVar63;
  undefined1 auVar50 [16];
  short sVar64;
  short sVar65;
  short sVar72;
  short sVar73;
  short sVar74;
  short sVar75;
  short sVar76;
  short sVar77;
  undefined1 auVar66 [16];
  short sVar78;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  short sVar88;
  ulong uVar90;
  ulong uVar91;
  short sVar94;
  short sVar96;
  short sVar98;
  short sVar100;
  short sVar102;
  short sVar104;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 in_XMM10 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 in_XMM13 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 in_XMM14 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  ulong local_a8;
  short sStack_94;
  short sStack_92;
  short local_88;
  short sStack_86;
  short local_58;
  short sStack_56;
  short local_48;
  short sStack_46;
  short sStack_44;
  short sStack_42;
  short sStack_40;
  short sStack_3e;
  short sStack_3c;
  short sStack_3a;
  ushort uVar21;
  ushort uVar34;
  ushort uVar36;
  ushort uVar38;
  ushort uVar40;
  ushort uVar42;
  ushort uVar44;
  ushort uVar46;
  ushort uVar89;
  ushort uVar95;
  ushort uVar97;
  ushort uVar99;
  ushort uVar101;
  ushort uVar103;
  ushort uVar105;
  ushort uVar106;
  
  lVar20 = (long)dir;
  lVar14 = (long)cdef_directions_padded[lVar20 + 4][0];
  lVar15 = (long)cdef_directions_padded[lVar20 + 4][1];
  lVar18 = (long)cdef_directions_padded[lVar20][0];
  lVar20 = (long)cdef_directions_padded[lVar20][1];
  if (block_width == 8) {
    uVar16 = sec_damping;
    if (sec_strength != 0) {
      iVar11 = 0x1f;
      if (sec_strength != 0) {
        for (; (uint)sec_strength >> iVar11 == 0; iVar11 = iVar11 + -1) {
        }
      }
      uVar16 = sec_damping - iVar11;
      if (sec_damping < iVar11) {
        uVar16 = 0;
      }
    }
    if (0 < block_height) {
      auVar25 = pshuflw(ZEXT416((uint)sec_strength),ZEXT416((uint)sec_strength),0);
      uVar23 = auVar25._0_4_;
      auVar25 = pshuflw(ZEXT416((uint)2),ZEXT416((uint)2),0);
      auVar26 = pshuflw(ZEXT416((uint)1),ZEXT416((uint)1),0);
      uVar24 = auVar26._0_4_;
      uVar19 = 0;
      do {
        auVar71 = *(undefined1 (*) [16])in;
        pauVar1 = (undefined1 (*) [16])((long)in + 0x120);
        sVar49 = *(short *)*pauVar1;
        sVar52 = *(short *)(*(undefined1 (*) [16])((long)in + 0x120) + 2);
        sVar54 = *(short *)(*(undefined1 (*) [16])((long)in + 0x120) + 4);
        sVar56 = *(short *)(*(undefined1 (*) [16])((long)in + 0x120) + 6);
        sVar58 = *(short *)(*(undefined1 (*) [16])((long)in + 0x120) + 8);
        sVar60 = *(short *)(*(undefined1 (*) [16])((long)in + 0x120) + 10);
        sVar62 = *(short *)(*(undefined1 (*) [16])((long)in + 0x120) + 0xc);
        auVar13 = *(undefined1 (*) [14])*pauVar1;
        sVar64 = *(short *)(*(undefined1 (*) [16])((long)in + 0x120) + 0xe);
        auVar156 = lddqu(in_XMM12,*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar14 * 2));
        auVar139 = lddqu(in_XMM11,*(undefined1 (*) [16])
                                   (*(undefined1 (*) [16])((long)in + 0x120) + lVar14 * 2));
        auVar170 = lddqu(in_XMM13,*(undefined1 (*) [16])((long)in + lVar14 * -2));
        auVar79 = lddqu(in_XMM4,*(undefined1 (*) [16])((long)in + lVar14 * -2 + 0x120));
        auVar118 = lddqu(in_XMM8,*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar18 * 2));
        auVar109 = lddqu(in_XMM7,*(undefined1 (*) [16])
                                  (*(undefined1 (*) [16])((long)in + 0x120) + lVar18 * 2));
        auVar133 = lddqu(in_XMM10,*(undefined1 (*) [16])((long)in + lVar18 * -2));
        auVar107 = lddqu(in_XMM6,*(undefined1 (*) [16])((long)in + lVar18 * -2 + 0x120));
        sVar48 = auVar71._0_2_;
        auVar157._0_2_ = auVar156._0_2_ - sVar48;
        sVar51 = auVar71._2_2_;
        auVar157._2_2_ = auVar156._2_2_ - sVar51;
        sVar53 = auVar71._4_2_;
        auVar157._4_2_ = auVar156._4_2_ - sVar53;
        sVar55 = auVar71._6_2_;
        auVar157._6_2_ = auVar156._6_2_ - sVar55;
        sVar57 = auVar71._8_2_;
        auVar157._8_2_ = auVar156._8_2_ - sVar57;
        sVar59 = auVar71._10_2_;
        auVar157._10_2_ = auVar156._10_2_ - sVar59;
        sVar61 = auVar71._12_2_;
        auVar157._12_2_ = auVar156._12_2_ - sVar61;
        sVar63 = auVar71._14_2_;
        auVar157._14_2_ = auVar156._14_2_ - sVar63;
        auVar140._0_2_ = auVar139._0_2_ - sVar49;
        auVar140._2_2_ = auVar139._2_2_ - sVar52;
        auVar140._4_2_ = auVar139._4_2_ - sVar54;
        auVar140._6_2_ = auVar139._6_2_ - sVar56;
        auVar140._8_2_ = auVar139._8_2_ - sVar58;
        auVar140._10_2_ = auVar139._10_2_ - sVar60;
        auVar140._12_2_ = auVar139._12_2_ - sVar62;
        auVar140._14_2_ = auVar139._14_2_ - sVar64;
        auVar180 = pabsw(in_XMM14,auVar157);
        auVar158 = psraw(auVar157,0xf);
        auVar50 = pabsw(auVar71,auVar140);
        local_a8 = (ulong)uVar16;
        uVar21 = auVar180._0_2_;
        auVar27._0_2_ = uVar21 >> local_a8;
        uVar34 = auVar180._2_2_;
        auVar27._2_2_ = uVar34 >> local_a8;
        uVar36 = auVar180._4_2_;
        auVar27._4_2_ = uVar36 >> local_a8;
        uVar38 = auVar180._6_2_;
        auVar27._6_2_ = uVar38 >> local_a8;
        uVar40 = auVar180._8_2_;
        auVar27._8_2_ = uVar40 >> local_a8;
        uVar42 = auVar180._10_2_;
        auVar27._10_2_ = uVar42 >> local_a8;
        uVar44 = auVar180._12_2_;
        uVar46 = auVar180._14_2_;
        auVar27._12_2_ = uVar44 >> local_a8;
        auVar27._14_2_ = uVar46 >> local_a8;
        auVar141 = psraw(auVar140,0xf);
        uVar89 = auVar50._0_2_;
        auVar187._0_2_ = uVar89 >> local_a8;
        uVar95 = auVar50._2_2_;
        auVar187._2_2_ = uVar95 >> local_a8;
        uVar97 = auVar50._4_2_;
        auVar187._4_2_ = uVar97 >> local_a8;
        uVar99 = auVar50._6_2_;
        auVar187._6_2_ = uVar99 >> local_a8;
        uVar101 = auVar50._8_2_;
        auVar187._8_2_ = uVar101 >> local_a8;
        uVar103 = auVar50._10_2_;
        auVar187._10_2_ = uVar103 >> local_a8;
        uVar105 = auVar50._12_2_;
        uVar106 = auVar50._14_2_;
        auVar187._12_2_ = uVar105 >> local_a8;
        auVar187._14_2_ = uVar106 >> local_a8;
        auVar139._4_4_ = uVar23;
        auVar139._0_4_ = uVar23;
        auVar139._8_4_ = uVar23;
        auVar139._12_4_ = uVar23;
        auVar66 = psubusw(auVar139,auVar27);
        auVar156 = psubusw(auVar139,auVar187);
        sVar65 = auVar66._0_2_;
        sVar72 = auVar66._2_2_;
        sVar73 = auVar66._4_2_;
        sVar74 = auVar66._6_2_;
        sVar75 = auVar66._8_2_;
        sVar76 = auVar66._10_2_;
        sVar77 = auVar66._12_2_;
        sVar78 = auVar66._14_2_;
        sVar22 = auVar156._0_2_;
        sVar35 = auVar156._2_2_;
        sVar37 = auVar156._4_2_;
        sVar39 = auVar156._6_2_;
        sVar41 = auVar156._8_2_;
        sVar43 = auVar156._10_2_;
        sVar45 = auVar156._12_2_;
        sVar47 = auVar156._14_2_;
        auVar67._0_2_ =
             (((short)uVar21 < sVar65) * uVar21 | (ushort)((short)uVar21 >= sVar65) * sVar65) +
             auVar158._0_2_;
        auVar67._2_2_ =
             (((short)uVar34 < sVar72) * uVar34 | (ushort)((short)uVar34 >= sVar72) * sVar72) +
             auVar158._2_2_;
        auVar67._4_2_ =
             (((short)uVar36 < sVar73) * uVar36 | (ushort)((short)uVar36 >= sVar73) * sVar73) +
             auVar158._4_2_;
        auVar67._6_2_ =
             (((short)uVar38 < sVar74) * uVar38 | (ushort)((short)uVar38 >= sVar74) * sVar74) +
             auVar158._6_2_;
        auVar67._8_2_ =
             (((short)uVar40 < sVar75) * uVar40 | (ushort)((short)uVar40 >= sVar75) * sVar75) +
             auVar158._8_2_;
        auVar67._10_2_ =
             (((short)uVar42 < sVar76) * uVar42 | (ushort)((short)uVar42 >= sVar76) * sVar76) +
             auVar158._10_2_;
        auVar67._12_2_ =
             (((short)uVar44 < sVar77) * uVar44 | (ushort)((short)uVar44 >= sVar77) * sVar77) +
             auVar158._12_2_;
        auVar67._14_2_ =
             (((short)uVar46 < sVar78) * uVar46 | (ushort)((short)uVar46 >= sVar78) * sVar78) +
             auVar158._14_2_;
        auVar28._0_2_ =
             (((short)uVar89 < sVar22) * uVar89 | (ushort)((short)uVar89 >= sVar22) * sVar22) +
             auVar141._0_2_;
        auVar28._2_2_ =
             (((short)uVar95 < sVar35) * uVar95 | (ushort)((short)uVar95 >= sVar35) * sVar35) +
             auVar141._2_2_;
        auVar28._4_2_ =
             (((short)uVar97 < sVar37) * uVar97 | (ushort)((short)uVar97 >= sVar37) * sVar37) +
             auVar141._4_2_;
        auVar28._6_2_ =
             (((short)uVar99 < sVar39) * uVar99 | (ushort)((short)uVar99 >= sVar39) * sVar39) +
             auVar141._6_2_;
        auVar28._8_2_ =
             (((short)uVar101 < sVar41) * uVar101 | (ushort)((short)uVar101 >= sVar41) * sVar41) +
             auVar141._8_2_;
        auVar28._10_2_ =
             (((short)uVar103 < sVar43) * uVar103 | (ushort)((short)uVar103 >= sVar43) * sVar43) +
             auVar141._10_2_;
        auVar28._12_2_ =
             (((short)uVar105 < sVar45) * uVar105 | (ushort)((short)uVar105 >= sVar45) * sVar45) +
             auVar141._12_2_;
        auVar28._14_2_ =
             (((short)uVar106 < sVar47) * uVar106 | (ushort)((short)uVar106 >= sVar47) * sVar47) +
             auVar141._14_2_;
        auVar67 = auVar67 ^ auVar158;
        auVar28 = auVar28 ^ auVar141;
        auVar171._0_2_ = auVar170._0_2_ - sVar48;
        auVar171._2_2_ = auVar170._2_2_ - sVar51;
        auVar171._4_2_ = auVar170._4_2_ - sVar53;
        auVar171._6_2_ = auVar170._6_2_ - sVar55;
        auVar171._8_2_ = auVar170._8_2_ - sVar57;
        auVar171._10_2_ = auVar170._10_2_ - sVar59;
        auVar171._12_2_ = auVar170._12_2_ - sVar61;
        auVar171._14_2_ = auVar170._14_2_ - sVar63;
        sVar88 = auVar13._0_2_;
        auVar80._0_2_ = auVar79._0_2_ - sVar88;
        sVar94 = auVar13._2_2_;
        auVar80._2_2_ = auVar79._2_2_ - sVar94;
        sVar96 = auVar13._4_2_;
        auVar80._4_2_ = auVar79._4_2_ - sVar96;
        sVar98 = auVar13._6_2_;
        auVar80._6_2_ = auVar79._6_2_ - sVar98;
        sVar100 = auVar13._8_2_;
        auVar80._8_2_ = auVar79._8_2_ - sVar100;
        sVar102 = auVar13._10_2_;
        auVar80._10_2_ = auVar79._10_2_ - sVar102;
        sVar104 = auVar13._12_2_;
        auVar80._12_2_ = auVar79._12_2_ - sVar104;
        auVar80._14_2_ = auVar79._14_2_ - sVar64;
        auVar156 = pabsw(auVar50,auVar171);
        auVar141 = psraw(auVar171,0xf);
        auVar50 = pabsw(auVar180,auVar80);
        auVar66 = psraw(auVar80,0xf);
        uVar21 = auVar156._0_2_;
        auVar142._0_2_ = uVar21 >> local_a8;
        uVar34 = auVar156._2_2_;
        auVar142._2_2_ = uVar34 >> local_a8;
        uVar36 = auVar156._4_2_;
        auVar142._4_2_ = uVar36 >> local_a8;
        uVar38 = auVar156._6_2_;
        auVar142._6_2_ = uVar38 >> local_a8;
        uVar40 = auVar156._8_2_;
        auVar142._8_2_ = uVar40 >> local_a8;
        uVar42 = auVar156._10_2_;
        auVar142._10_2_ = uVar42 >> local_a8;
        uVar44 = auVar156._12_2_;
        uVar46 = auVar156._14_2_;
        auVar142._12_2_ = uVar44 >> local_a8;
        auVar142._14_2_ = uVar46 >> local_a8;
        uVar89 = auVar50._0_2_;
        auVar188._0_2_ = uVar89 >> local_a8;
        uVar95 = auVar50._2_2_;
        auVar188._2_2_ = uVar95 >> local_a8;
        uVar97 = auVar50._4_2_;
        auVar188._4_2_ = uVar97 >> local_a8;
        uVar99 = auVar50._6_2_;
        auVar188._6_2_ = uVar99 >> local_a8;
        uVar101 = auVar50._8_2_;
        auVar188._8_2_ = uVar101 >> local_a8;
        uVar103 = auVar50._10_2_;
        auVar188._10_2_ = uVar103 >> local_a8;
        uVar105 = auVar50._12_2_;
        uVar106 = auVar50._14_2_;
        auVar188._12_2_ = uVar105 >> local_a8;
        auVar188._14_2_ = uVar106 >> local_a8;
        auVar79 = psubusw(auVar139,auVar142);
        auVar50 = psubusw(auVar139,auVar188);
        sVar65 = auVar79._0_2_;
        sVar72 = auVar79._2_2_;
        sVar73 = auVar79._4_2_;
        sVar74 = auVar79._6_2_;
        sVar75 = auVar79._8_2_;
        sVar76 = auVar79._10_2_;
        sVar77 = auVar79._12_2_;
        sVar78 = auVar79._14_2_;
        sVar22 = auVar50._0_2_;
        sVar35 = auVar50._2_2_;
        sVar37 = auVar50._4_2_;
        sVar39 = auVar50._6_2_;
        sVar41 = auVar50._8_2_;
        sVar43 = auVar50._10_2_;
        sVar45 = auVar50._12_2_;
        sVar47 = auVar50._14_2_;
        auVar159._0_2_ =
             (((short)uVar21 < sVar65) * uVar21 | (ushort)((short)uVar21 >= sVar65) * sVar65) +
             auVar141._0_2_;
        auVar159._2_2_ =
             (((short)uVar34 < sVar72) * uVar34 | (ushort)((short)uVar34 >= sVar72) * sVar72) +
             auVar141._2_2_;
        auVar159._4_2_ =
             (((short)uVar36 < sVar73) * uVar36 | (ushort)((short)uVar36 >= sVar73) * sVar73) +
             auVar141._4_2_;
        auVar159._6_2_ =
             (((short)uVar38 < sVar74) * uVar38 | (ushort)((short)uVar38 >= sVar74) * sVar74) +
             auVar141._6_2_;
        auVar159._8_2_ =
             (((short)uVar40 < sVar75) * uVar40 | (ushort)((short)uVar40 >= sVar75) * sVar75) +
             auVar141._8_2_;
        auVar159._10_2_ =
             (((short)uVar42 < sVar76) * uVar42 | (ushort)((short)uVar42 >= sVar76) * sVar76) +
             auVar141._10_2_;
        auVar159._12_2_ =
             (((short)uVar44 < sVar77) * uVar44 | (ushort)((short)uVar44 >= sVar77) * sVar77) +
             auVar141._12_2_;
        auVar159._14_2_ =
             (((short)uVar46 < sVar78) * uVar46 | (ushort)((short)uVar46 >= sVar78) * sVar78) +
             auVar141._14_2_;
        auVar143._0_2_ =
             (((short)uVar89 < sVar22) * uVar89 | (ushort)((short)uVar89 >= sVar22) * sVar22) +
             auVar66._0_2_;
        auVar143._2_2_ =
             (((short)uVar95 < sVar35) * uVar95 | (ushort)((short)uVar95 >= sVar35) * sVar35) +
             auVar66._2_2_;
        auVar143._4_2_ =
             (((short)uVar97 < sVar37) * uVar97 | (ushort)((short)uVar97 >= sVar37) * sVar37) +
             auVar66._4_2_;
        auVar143._6_2_ =
             (((short)uVar99 < sVar39) * uVar99 | (ushort)((short)uVar99 >= sVar39) * sVar39) +
             auVar66._6_2_;
        auVar143._8_2_ =
             (((short)uVar101 < sVar41) * uVar101 | (ushort)((short)uVar101 >= sVar41) * sVar41) +
             auVar66._8_2_;
        auVar143._10_2_ =
             (((short)uVar103 < sVar43) * uVar103 | (ushort)((short)uVar103 >= sVar43) * sVar43) +
             auVar66._10_2_;
        auVar143._12_2_ =
             (((short)uVar105 < sVar45) * uVar105 | (ushort)((short)uVar105 >= sVar45) * sVar45) +
             auVar66._12_2_;
        auVar143._14_2_ =
             (((short)uVar106 < sVar47) * uVar106 | (ushort)((short)uVar106 >= sVar47) * sVar47) +
             auVar66._14_2_;
        auVar159 = auVar159 ^ auVar141;
        auVar160._0_2_ = auVar159._0_2_ + auVar67._0_2_;
        auVar160._2_2_ = auVar159._2_2_ + auVar67._2_2_;
        auVar160._4_2_ = auVar159._4_2_ + auVar67._4_2_;
        auVar160._6_2_ = auVar159._6_2_ + auVar67._6_2_;
        auVar160._8_2_ = auVar159._8_2_ + auVar67._8_2_;
        auVar160._10_2_ = auVar159._10_2_ + auVar67._10_2_;
        auVar160._12_2_ = auVar159._12_2_ + auVar67._12_2_;
        auVar160._14_2_ = auVar159._14_2_ + auVar67._14_2_;
        auVar143 = auVar143 ^ auVar66;
        auVar144._0_2_ = auVar143._0_2_ + auVar28._0_2_;
        auVar144._2_2_ = auVar143._2_2_ + auVar28._2_2_;
        auVar144._4_2_ = auVar143._4_2_ + auVar28._4_2_;
        auVar144._6_2_ = auVar143._6_2_ + auVar28._6_2_;
        auVar144._8_2_ = auVar143._8_2_ + auVar28._8_2_;
        auVar144._10_2_ = auVar143._10_2_ + auVar28._10_2_;
        auVar144._12_2_ = auVar143._12_2_ + auVar28._12_2_;
        auVar144._14_2_ = auVar143._14_2_ + auVar28._14_2_;
        auVar119._0_2_ = auVar118._0_2_ - sVar48;
        auVar119._2_2_ = auVar118._2_2_ - sVar51;
        auVar119._4_2_ = auVar118._4_2_ - sVar53;
        auVar119._6_2_ = auVar118._6_2_ - sVar55;
        auVar119._8_2_ = auVar118._8_2_ - sVar57;
        auVar119._10_2_ = auVar118._10_2_ - sVar59;
        auVar119._12_2_ = auVar118._12_2_ - sVar61;
        auVar119._14_2_ = auVar118._14_2_ - sVar63;
        auVar110._0_2_ = auVar109._0_2_ - sVar88;
        auVar110._2_2_ = auVar109._2_2_ - sVar94;
        auVar110._4_2_ = auVar109._4_2_ - sVar96;
        auVar110._6_2_ = auVar109._6_2_ - sVar98;
        auVar110._8_2_ = auVar109._8_2_ - sVar100;
        auVar110._10_2_ = auVar109._10_2_ - sVar102;
        auVar110._12_2_ = auVar109._12_2_ - sVar104;
        auVar110._14_2_ = auVar109._14_2_ - sVar64;
        auVar50 = pabsw(auVar156,auVar119);
        auVar118 = psraw(auVar119,0xf);
        auVar79 = pabsw(auVar66,auVar110);
        auVar109 = psraw(auVar110,0xf);
        uVar21 = auVar50._0_2_;
        auVar29._0_2_ = uVar21 >> local_a8;
        uVar34 = auVar50._2_2_;
        auVar29._2_2_ = uVar34 >> local_a8;
        uVar36 = auVar50._4_2_;
        auVar29._4_2_ = uVar36 >> local_a8;
        uVar38 = auVar50._6_2_;
        auVar29._6_2_ = uVar38 >> local_a8;
        uVar40 = auVar50._8_2_;
        auVar29._8_2_ = uVar40 >> local_a8;
        uVar42 = auVar50._10_2_;
        auVar29._10_2_ = uVar42 >> local_a8;
        uVar44 = auVar50._12_2_;
        uVar46 = auVar50._14_2_;
        auVar29._12_2_ = uVar44 >> local_a8;
        auVar29._14_2_ = uVar46 >> local_a8;
        uVar89 = auVar79._0_2_;
        auVar172._0_2_ = uVar89 >> local_a8;
        uVar95 = auVar79._2_2_;
        auVar172._2_2_ = uVar95 >> local_a8;
        uVar97 = auVar79._4_2_;
        auVar172._4_2_ = uVar97 >> local_a8;
        uVar99 = auVar79._6_2_;
        auVar172._6_2_ = uVar99 >> local_a8;
        uVar101 = auVar79._8_2_;
        auVar172._8_2_ = uVar101 >> local_a8;
        uVar103 = auVar79._10_2_;
        auVar172._10_2_ = uVar103 >> local_a8;
        uVar105 = auVar79._12_2_;
        uVar106 = auVar79._14_2_;
        auVar172._12_2_ = uVar105 >> local_a8;
        auVar172._14_2_ = uVar106 >> local_a8;
        auVar66 = psubusw(auVar139,auVar29);
        auVar156 = psubusw(auVar139,auVar172);
        sVar65 = auVar66._0_2_;
        sVar72 = auVar66._2_2_;
        sVar73 = auVar66._4_2_;
        sVar74 = auVar66._6_2_;
        sVar75 = auVar66._8_2_;
        sVar76 = auVar66._10_2_;
        sVar77 = auVar66._12_2_;
        sVar78 = auVar66._14_2_;
        sVar22 = auVar156._0_2_;
        sVar35 = auVar156._2_2_;
        sVar37 = auVar156._4_2_;
        sVar39 = auVar156._6_2_;
        sVar41 = auVar156._8_2_;
        sVar43 = auVar156._10_2_;
        sVar45 = auVar156._12_2_;
        sVar47 = auVar156._14_2_;
        auVar68._0_2_ =
             (((short)uVar21 < sVar65) * uVar21 | (ushort)((short)uVar21 >= sVar65) * sVar65) +
             auVar118._0_2_;
        auVar68._2_2_ =
             (((short)uVar34 < sVar72) * uVar34 | (ushort)((short)uVar34 >= sVar72) * sVar72) +
             auVar118._2_2_;
        auVar68._4_2_ =
             (((short)uVar36 < sVar73) * uVar36 | (ushort)((short)uVar36 >= sVar73) * sVar73) +
             auVar118._4_2_;
        auVar68._6_2_ =
             (((short)uVar38 < sVar74) * uVar38 | (ushort)((short)uVar38 >= sVar74) * sVar74) +
             auVar118._6_2_;
        auVar68._8_2_ =
             (((short)uVar40 < sVar75) * uVar40 | (ushort)((short)uVar40 >= sVar75) * sVar75) +
             auVar118._8_2_;
        auVar68._10_2_ =
             (((short)uVar42 < sVar76) * uVar42 | (ushort)((short)uVar42 >= sVar76) * sVar76) +
             auVar118._10_2_;
        auVar68._12_2_ =
             (((short)uVar44 < sVar77) * uVar44 | (ushort)((short)uVar44 >= sVar77) * sVar77) +
             auVar118._12_2_;
        auVar68._14_2_ =
             (((short)uVar46 < sVar78) * uVar46 | (ushort)((short)uVar46 >= sVar78) * sVar78) +
             auVar118._14_2_;
        auVar30._0_2_ =
             (((short)uVar89 < sVar22) * uVar89 | (ushort)((short)uVar89 >= sVar22) * sVar22) +
             auVar109._0_2_;
        auVar30._2_2_ =
             (((short)uVar95 < sVar35) * uVar95 | (ushort)((short)uVar95 >= sVar35) * sVar35) +
             auVar109._2_2_;
        auVar30._4_2_ =
             (((short)uVar97 < sVar37) * uVar97 | (ushort)((short)uVar97 >= sVar37) * sVar37) +
             auVar109._4_2_;
        auVar30._6_2_ =
             (((short)uVar99 < sVar39) * uVar99 | (ushort)((short)uVar99 >= sVar39) * sVar39) +
             auVar109._6_2_;
        auVar30._8_2_ =
             (((short)uVar101 < sVar41) * uVar101 | (ushort)((short)uVar101 >= sVar41) * sVar41) +
             auVar109._8_2_;
        auVar30._10_2_ =
             (((short)uVar103 < sVar43) * uVar103 | (ushort)((short)uVar103 >= sVar43) * sVar43) +
             auVar109._10_2_;
        auVar30._12_2_ =
             (((short)uVar105 < sVar45) * uVar105 | (ushort)((short)uVar105 >= sVar45) * sVar45) +
             auVar109._12_2_;
        auVar30._14_2_ =
             (((short)uVar106 < sVar47) * uVar106 | (ushort)((short)uVar106 >= sVar47) * sVar47) +
             auVar109._14_2_;
        auVar68 = auVar68 ^ auVar118;
        auVar30 = auVar30 ^ auVar109;
        auVar134._0_2_ = auVar133._0_2_ - sVar48;
        auVar134._2_2_ = auVar133._2_2_ - sVar51;
        auVar134._4_2_ = auVar133._4_2_ - sVar53;
        auVar134._6_2_ = auVar133._6_2_ - sVar55;
        auVar134._8_2_ = auVar133._8_2_ - sVar57;
        auVar134._10_2_ = auVar133._10_2_ - sVar59;
        auVar134._12_2_ = auVar133._12_2_ - sVar61;
        auVar134._14_2_ = auVar133._14_2_ - sVar63;
        auVar108._0_2_ = auVar107._0_2_ - sVar88;
        auVar108._2_2_ = auVar107._2_2_ - sVar94;
        auVar108._4_2_ = auVar107._4_2_ - sVar96;
        auVar108._6_2_ = auVar107._6_2_ - sVar98;
        auVar108._8_2_ = auVar107._8_2_ - sVar100;
        auVar108._10_2_ = auVar107._10_2_ - sVar102;
        auVar108._12_2_ = auVar107._12_2_ - sVar104;
        auVar108._14_2_ = auVar107._14_2_ - sVar64;
        auVar50 = pabsw(auVar50,auVar134);
        auVar109 = psraw(auVar134,0xf);
        auVar156 = pabsw(auVar79,auVar108);
        uVar21 = auVar50._0_2_;
        auVar111._0_2_ = uVar21 >> local_a8;
        uVar34 = auVar50._2_2_;
        auVar111._2_2_ = uVar34 >> local_a8;
        uVar36 = auVar50._4_2_;
        auVar111._4_2_ = uVar36 >> local_a8;
        uVar38 = auVar50._6_2_;
        auVar111._6_2_ = uVar38 >> local_a8;
        uVar40 = auVar50._8_2_;
        auVar111._8_2_ = uVar40 >> local_a8;
        uVar42 = auVar50._10_2_;
        auVar111._10_2_ = uVar42 >> local_a8;
        uVar44 = auVar50._12_2_;
        uVar46 = auVar50._14_2_;
        auVar111._12_2_ = uVar44 >> local_a8;
        auVar111._14_2_ = uVar46 >> local_a8;
        auVar66 = psraw(auVar108,0xf);
        uVar89 = auVar156._0_2_;
        auVar173._0_2_ = uVar89 >> local_a8;
        uVar95 = auVar156._2_2_;
        auVar173._2_2_ = uVar95 >> local_a8;
        uVar97 = auVar156._4_2_;
        auVar173._4_2_ = uVar97 >> local_a8;
        uVar99 = auVar156._6_2_;
        auVar173._6_2_ = uVar99 >> local_a8;
        uVar101 = auVar156._8_2_;
        auVar173._8_2_ = uVar101 >> local_a8;
        uVar103 = auVar156._10_2_;
        auVar173._10_2_ = uVar103 >> local_a8;
        uVar105 = auVar156._12_2_;
        uVar106 = auVar156._14_2_;
        auVar173._12_2_ = uVar105 >> local_a8;
        auVar173._14_2_ = uVar106 >> local_a8;
        auVar107 = psubusw(auVar139,auVar111);
        auVar79 = psubusw(auVar139,auVar173);
        sVar65 = auVar107._0_2_;
        sVar72 = auVar107._2_2_;
        sVar73 = auVar107._4_2_;
        sVar74 = auVar107._6_2_;
        sVar75 = auVar107._8_2_;
        sVar76 = auVar107._10_2_;
        sVar77 = auVar107._12_2_;
        sVar78 = auVar107._14_2_;
        sVar22 = auVar79._0_2_;
        sVar35 = auVar79._2_2_;
        sVar37 = auVar79._4_2_;
        sVar39 = auVar79._6_2_;
        sVar41 = auVar79._8_2_;
        sVar43 = auVar79._10_2_;
        sVar45 = auVar79._12_2_;
        sVar47 = auVar79._14_2_;
        auVar120._0_2_ =
             (((short)uVar21 < sVar65) * uVar21 | (ushort)((short)uVar21 >= sVar65) * sVar65) +
             auVar109._0_2_;
        auVar120._2_2_ =
             (((short)uVar34 < sVar72) * uVar34 | (ushort)((short)uVar34 >= sVar72) * sVar72) +
             auVar109._2_2_;
        auVar120._4_2_ =
             (((short)uVar36 < sVar73) * uVar36 | (ushort)((short)uVar36 >= sVar73) * sVar73) +
             auVar109._4_2_;
        auVar120._6_2_ =
             (((short)uVar38 < sVar74) * uVar38 | (ushort)((short)uVar38 >= sVar74) * sVar74) +
             auVar109._6_2_;
        auVar120._8_2_ =
             (((short)uVar40 < sVar75) * uVar40 | (ushort)((short)uVar40 >= sVar75) * sVar75) +
             auVar109._8_2_;
        auVar120._10_2_ =
             (((short)uVar42 < sVar76) * uVar42 | (ushort)((short)uVar42 >= sVar76) * sVar76) +
             auVar109._10_2_;
        auVar120._12_2_ =
             (((short)uVar44 < sVar77) * uVar44 | (ushort)((short)uVar44 >= sVar77) * sVar77) +
             auVar109._12_2_;
        auVar120._14_2_ =
             (((short)uVar46 < sVar78) * uVar46 | (ushort)((short)uVar46 >= sVar78) * sVar78) +
             auVar109._14_2_;
        auVar112._0_2_ =
             (((short)uVar89 < sVar22) * uVar89 | (ushort)((short)uVar89 >= sVar22) * sVar22) +
             auVar66._0_2_;
        auVar112._2_2_ =
             (((short)uVar95 < sVar35) * uVar95 | (ushort)((short)uVar95 >= sVar35) * sVar35) +
             auVar66._2_2_;
        auVar112._4_2_ =
             (((short)uVar97 < sVar37) * uVar97 | (ushort)((short)uVar97 >= sVar37) * sVar37) +
             auVar66._4_2_;
        auVar112._6_2_ =
             (((short)uVar99 < sVar39) * uVar99 | (ushort)((short)uVar99 >= sVar39) * sVar39) +
             auVar66._6_2_;
        auVar112._8_2_ =
             (((short)uVar101 < sVar41) * uVar101 | (ushort)((short)uVar101 >= sVar41) * sVar41) +
             auVar66._8_2_;
        auVar112._10_2_ =
             (((short)uVar103 < sVar43) * uVar103 | (ushort)((short)uVar103 >= sVar43) * sVar43) +
             auVar66._10_2_;
        auVar112._12_2_ =
             (((short)uVar105 < sVar45) * uVar105 | (ushort)((short)uVar105 >= sVar45) * sVar45) +
             auVar66._12_2_;
        auVar112._14_2_ =
             (((short)uVar106 < sVar47) * uVar106 | (ushort)((short)uVar106 >= sVar47) * sVar47) +
             auVar66._14_2_;
        auVar120 = auVar120 ^ auVar109;
        auVar112 = auVar112 ^ auVar66;
        auVar79 = lddqu(auVar160,*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar15 * 2));
        auVar66 = lddqu(auVar144,*(undefined1 (*) [16])
                                  (*(undefined1 (*) [16])((long)in + 0x120) + lVar15 * 2));
        auVar107 = lddqu(auVar156,*(undefined1 (*) [16])((long)in + lVar15 * -2));
        auVar141 = lddqu(auVar188,*(undefined1 (*) [16])((long)in + lVar15 * -2 + 0x120));
        auVar109 = lddqu(auVar109,*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar20 * 2));
        auVar156 = lddqu(auVar30,*(undefined1 (*) [16])
                                  (*(undefined1 (*) [16])((long)in + 0x120) + lVar20 * 2));
        auVar161._0_2_ = auVar79._0_2_ - sVar48;
        auVar161._2_2_ = auVar79._2_2_ - sVar51;
        auVar161._4_2_ = auVar79._4_2_ - sVar53;
        auVar161._6_2_ = auVar79._6_2_ - sVar55;
        auVar161._8_2_ = auVar79._8_2_ - sVar57;
        auVar161._10_2_ = auVar79._10_2_ - sVar59;
        auVar161._12_2_ = auVar79._12_2_ - sVar61;
        auVar161._14_2_ = auVar79._14_2_ - sVar63;
        auVar145._0_2_ = auVar66._0_2_ - sVar88;
        auVar145._2_2_ = auVar66._2_2_ - sVar94;
        auVar145._4_2_ = auVar66._4_2_ - sVar96;
        auVar145._6_2_ = auVar66._6_2_ - sVar98;
        auVar145._8_2_ = auVar66._8_2_ - sVar100;
        auVar145._10_2_ = auVar66._10_2_ - sVar102;
        auVar145._12_2_ = auVar66._12_2_ - sVar104;
        auVar145._14_2_ = auVar66._14_2_ - sVar64;
        auVar66 = pabsw(auVar50,auVar161);
        auVar133 = psraw(auVar161,0xf);
        auVar50 = pabsw(auVar173,auVar145);
        uVar21 = auVar66._0_2_;
        auVar31._0_2_ = uVar21 >> local_a8;
        uVar34 = auVar66._2_2_;
        auVar31._2_2_ = uVar34 >> local_a8;
        uVar36 = auVar66._4_2_;
        auVar31._4_2_ = uVar36 >> local_a8;
        uVar38 = auVar66._6_2_;
        auVar31._6_2_ = uVar38 >> local_a8;
        uVar40 = auVar66._8_2_;
        auVar31._8_2_ = uVar40 >> local_a8;
        uVar42 = auVar66._10_2_;
        auVar31._10_2_ = uVar42 >> local_a8;
        uVar44 = auVar66._12_2_;
        uVar46 = auVar66._14_2_;
        auVar31._12_2_ = uVar44 >> local_a8;
        auVar31._14_2_ = uVar46 >> local_a8;
        auVar118 = psraw(auVar145,0xf);
        uVar89 = auVar50._0_2_;
        auVar181._0_2_ = uVar89 >> local_a8;
        uVar95 = auVar50._2_2_;
        auVar181._2_2_ = uVar95 >> local_a8;
        uVar97 = auVar50._4_2_;
        auVar181._4_2_ = uVar97 >> local_a8;
        uVar99 = auVar50._6_2_;
        auVar181._6_2_ = uVar99 >> local_a8;
        uVar101 = auVar50._8_2_;
        auVar181._8_2_ = uVar101 >> local_a8;
        uVar103 = auVar50._10_2_;
        auVar181._10_2_ = uVar103 >> local_a8;
        uVar105 = auVar50._12_2_;
        uVar106 = auVar50._14_2_;
        auVar181._12_2_ = uVar105 >> local_a8;
        auVar181._14_2_ = uVar106 >> local_a8;
        auVar79 = psubusw(auVar139,auVar31);
        auVar50 = psubusw(auVar139,auVar181);
        sVar65 = auVar79._0_2_;
        sVar72 = auVar79._2_2_;
        sVar73 = auVar79._4_2_;
        sVar74 = auVar79._6_2_;
        sVar75 = auVar79._8_2_;
        sVar76 = auVar79._10_2_;
        sVar77 = auVar79._12_2_;
        sVar78 = auVar79._14_2_;
        sVar22 = auVar50._0_2_;
        sVar35 = auVar50._2_2_;
        sVar37 = auVar50._4_2_;
        sVar39 = auVar50._6_2_;
        sVar41 = auVar50._8_2_;
        sVar43 = auVar50._10_2_;
        sVar45 = auVar50._12_2_;
        sVar47 = auVar50._14_2_;
        auVar69._0_2_ =
             (((short)uVar21 < sVar65) * uVar21 | (ushort)((short)uVar21 >= sVar65) * sVar65) +
             auVar133._0_2_;
        auVar69._2_2_ =
             (((short)uVar34 < sVar72) * uVar34 | (ushort)((short)uVar34 >= sVar72) * sVar72) +
             auVar133._2_2_;
        auVar69._4_2_ =
             (((short)uVar36 < sVar73) * uVar36 | (ushort)((short)uVar36 >= sVar73) * sVar73) +
             auVar133._4_2_;
        auVar69._6_2_ =
             (((short)uVar38 < sVar74) * uVar38 | (ushort)((short)uVar38 >= sVar74) * sVar74) +
             auVar133._6_2_;
        auVar69._8_2_ =
             (((short)uVar40 < sVar75) * uVar40 | (ushort)((short)uVar40 >= sVar75) * sVar75) +
             auVar133._8_2_;
        auVar69._10_2_ =
             (((short)uVar42 < sVar76) * uVar42 | (ushort)((short)uVar42 >= sVar76) * sVar76) +
             auVar133._10_2_;
        auVar69._12_2_ =
             (((short)uVar44 < sVar77) * uVar44 | (ushort)((short)uVar44 >= sVar77) * sVar77) +
             auVar133._12_2_;
        auVar69._14_2_ =
             (((short)uVar46 < sVar78) * uVar46 | (ushort)((short)uVar46 >= sVar78) * sVar78) +
             auVar133._14_2_;
        auVar32._0_2_ =
             (((short)uVar89 < sVar22) * uVar89 | (ushort)((short)uVar89 >= sVar22) * sVar22) +
             auVar118._0_2_;
        auVar32._2_2_ =
             (((short)uVar95 < sVar35) * uVar95 | (ushort)((short)uVar95 >= sVar35) * sVar35) +
             auVar118._2_2_;
        auVar32._4_2_ =
             (((short)uVar97 < sVar37) * uVar97 | (ushort)((short)uVar97 >= sVar37) * sVar37) +
             auVar118._4_2_;
        auVar32._6_2_ =
             (((short)uVar99 < sVar39) * uVar99 | (ushort)((short)uVar99 >= sVar39) * sVar39) +
             auVar118._6_2_;
        auVar32._8_2_ =
             (((short)uVar101 < sVar41) * uVar101 | (ushort)((short)uVar101 >= sVar41) * sVar41) +
             auVar118._8_2_;
        auVar32._10_2_ =
             (((short)uVar103 < sVar43) * uVar103 | (ushort)((short)uVar103 >= sVar43) * sVar43) +
             auVar118._10_2_;
        auVar32._12_2_ =
             (((short)uVar105 < sVar45) * uVar105 | (ushort)((short)uVar105 >= sVar45) * sVar45) +
             auVar118._12_2_;
        auVar32._14_2_ =
             (((short)uVar106 < sVar47) * uVar106 | (ushort)((short)uVar106 >= sVar47) * sVar47) +
             auVar118._14_2_;
        auVar69 = auVar69 ^ auVar133;
        auVar32 = auVar32 ^ auVar118;
        auVar81._0_2_ = auVar107._0_2_ - sVar48;
        auVar81._2_2_ = auVar107._2_2_ - sVar51;
        auVar81._4_2_ = auVar107._4_2_ - sVar53;
        auVar81._6_2_ = auVar107._6_2_ - sVar55;
        auVar81._8_2_ = auVar107._8_2_ - sVar57;
        auVar81._10_2_ = auVar107._10_2_ - sVar59;
        auVar81._12_2_ = auVar107._12_2_ - sVar61;
        auVar81._14_2_ = auVar107._14_2_ - sVar63;
        auVar189._0_2_ = auVar141._0_2_ - sVar88;
        auVar189._2_2_ = auVar141._2_2_ - sVar94;
        auVar189._4_2_ = auVar141._4_2_ - sVar96;
        auVar189._6_2_ = auVar141._6_2_ - sVar98;
        auVar189._8_2_ = auVar141._8_2_ - sVar100;
        auVar189._10_2_ = auVar141._10_2_ - sVar102;
        auVar189._12_2_ = auVar141._12_2_ - sVar104;
        auVar189._14_2_ = auVar141._14_2_ - sVar64;
        auVar50 = pabsw(auVar66,auVar81);
        uVar21 = auVar50._0_2_;
        auVar146._0_2_ = uVar21 >> local_a8;
        uVar34 = auVar50._2_2_;
        auVar146._2_2_ = uVar34 >> local_a8;
        uVar36 = auVar50._4_2_;
        auVar146._4_2_ = uVar36 >> local_a8;
        uVar38 = auVar50._6_2_;
        auVar146._6_2_ = uVar38 >> local_a8;
        uVar40 = auVar50._8_2_;
        auVar146._8_2_ = uVar40 >> local_a8;
        uVar42 = auVar50._10_2_;
        auVar146._10_2_ = uVar42 >> local_a8;
        uVar44 = auVar50._12_2_;
        uVar46 = auVar50._14_2_;
        auVar146._12_2_ = uVar44 >> local_a8;
        auVar146._14_2_ = uVar46 >> local_a8;
        auVar66 = pabsw(*pauVar1,auVar189);
        uVar89 = auVar66._0_2_;
        auVar174._0_2_ = uVar89 >> local_a8;
        uVar95 = auVar66._2_2_;
        auVar174._2_2_ = uVar95 >> local_a8;
        uVar97 = auVar66._4_2_;
        auVar174._4_2_ = uVar97 >> local_a8;
        uVar99 = auVar66._6_2_;
        auVar174._6_2_ = uVar99 >> local_a8;
        uVar101 = auVar66._8_2_;
        auVar174._8_2_ = uVar101 >> local_a8;
        uVar103 = auVar66._10_2_;
        auVar174._10_2_ = uVar103 >> local_a8;
        uVar105 = auVar66._12_2_;
        uVar106 = auVar66._14_2_;
        auVar174._12_2_ = uVar105 >> local_a8;
        auVar174._14_2_ = uVar106 >> local_a8;
        auVar66 = psubusw(auVar139,auVar146);
        auVar79 = psubusw(auVar139,auVar174);
        auVar118 = lddqu(auVar181,*(undefined1 (*) [16])((long)in + lVar20 * -2));
        sVar65 = auVar66._0_2_;
        sVar72 = auVar66._2_2_;
        sVar73 = auVar66._4_2_;
        sVar74 = auVar66._6_2_;
        sVar75 = auVar66._8_2_;
        sVar76 = auVar66._10_2_;
        sVar77 = auVar66._12_2_;
        sVar78 = auVar66._14_2_;
        auVar107 = lddqu(auVar174,*(undefined1 (*) [16])((long)in + lVar20 * -2 + 0x120));
        auVar66 = psraw(auVar81,0xf);
        auVar133 = psraw(auVar189,0xf);
        sVar22 = auVar79._0_2_;
        sVar35 = auVar79._2_2_;
        sVar37 = auVar79._4_2_;
        sVar39 = auVar79._6_2_;
        sVar41 = auVar79._8_2_;
        sVar43 = auVar79._10_2_;
        sVar45 = auVar79._12_2_;
        sVar47 = auVar79._14_2_;
        auVar162._0_2_ =
             (((short)uVar21 < sVar65) * uVar21 | (ushort)((short)uVar21 >= sVar65) * sVar65) +
             auVar66._0_2_;
        auVar162._2_2_ =
             (((short)uVar34 < sVar72) * uVar34 | (ushort)((short)uVar34 >= sVar72) * sVar72) +
             auVar66._2_2_;
        auVar162._4_2_ =
             (((short)uVar36 < sVar73) * uVar36 | (ushort)((short)uVar36 >= sVar73) * sVar73) +
             auVar66._4_2_;
        auVar162._6_2_ =
             (((short)uVar38 < sVar74) * uVar38 | (ushort)((short)uVar38 >= sVar74) * sVar74) +
             auVar66._6_2_;
        auVar162._8_2_ =
             (((short)uVar40 < sVar75) * uVar40 | (ushort)((short)uVar40 >= sVar75) * sVar75) +
             auVar66._8_2_;
        auVar162._10_2_ =
             (((short)uVar42 < sVar76) * uVar42 | (ushort)((short)uVar42 >= sVar76) * sVar76) +
             auVar66._10_2_;
        auVar162._12_2_ =
             (((short)uVar44 < sVar77) * uVar44 | (ushort)((short)uVar44 >= sVar77) * sVar77) +
             auVar66._12_2_;
        auVar162._14_2_ =
             (((short)uVar46 < sVar78) * uVar46 | (ushort)((short)uVar46 >= sVar78) * sVar78) +
             auVar66._14_2_;
        auVar147._0_2_ =
             (((short)uVar89 < sVar22) * uVar89 | (ushort)((short)uVar89 >= sVar22) * sVar22) +
             auVar133._0_2_;
        auVar147._2_2_ =
             (((short)uVar95 < sVar35) * uVar95 | (ushort)((short)uVar95 >= sVar35) * sVar35) +
             auVar133._2_2_;
        auVar147._4_2_ =
             (((short)uVar97 < sVar37) * uVar97 | (ushort)((short)uVar97 >= sVar37) * sVar37) +
             auVar133._4_2_;
        auVar147._6_2_ =
             (((short)uVar99 < sVar39) * uVar99 | (ushort)((short)uVar99 >= sVar39) * sVar39) +
             auVar133._6_2_;
        auVar147._8_2_ =
             (((short)uVar101 < sVar41) * uVar101 | (ushort)((short)uVar101 >= sVar41) * sVar41) +
             auVar133._8_2_;
        auVar147._10_2_ =
             (((short)uVar103 < sVar43) * uVar103 | (ushort)((short)uVar103 >= sVar43) * sVar43) +
             auVar133._10_2_;
        auVar147._12_2_ =
             (((short)uVar105 < sVar45) * uVar105 | (ushort)((short)uVar105 >= sVar45) * sVar45) +
             auVar133._12_2_;
        auVar147._14_2_ =
             (((short)uVar106 < sVar47) * uVar106 | (ushort)((short)uVar106 >= sVar47) * sVar47) +
             auVar133._14_2_;
        auVar162 = auVar162 ^ auVar66;
        in_XMM12._0_2_ = auVar162._0_2_ + auVar69._0_2_;
        in_XMM12._2_2_ = auVar162._2_2_ + auVar69._2_2_;
        in_XMM12._4_2_ = auVar162._4_2_ + auVar69._4_2_;
        in_XMM12._6_2_ = auVar162._6_2_ + auVar69._6_2_;
        in_XMM12._8_2_ = auVar162._8_2_ + auVar69._8_2_;
        in_XMM12._10_2_ = auVar162._10_2_ + auVar69._10_2_;
        in_XMM12._12_2_ = auVar162._12_2_ + auVar69._12_2_;
        in_XMM12._14_2_ = auVar162._14_2_ + auVar69._14_2_;
        auVar147 = auVar147 ^ auVar133;
        in_XMM11._0_2_ = auVar147._0_2_ + auVar32._0_2_;
        in_XMM11._2_2_ = auVar147._2_2_ + auVar32._2_2_;
        in_XMM11._4_2_ = auVar147._4_2_ + auVar32._4_2_;
        in_XMM11._6_2_ = auVar147._6_2_ + auVar32._6_2_;
        in_XMM11._8_2_ = auVar147._8_2_ + auVar32._8_2_;
        in_XMM11._10_2_ = auVar147._10_2_ + auVar32._10_2_;
        in_XMM11._12_2_ = auVar147._12_2_ + auVar32._12_2_;
        in_XMM11._14_2_ = auVar147._14_2_ + auVar32._14_2_;
        auVar135._0_2_ = auVar109._0_2_ - sVar48;
        auVar135._2_2_ = auVar109._2_2_ - sVar51;
        auVar135._4_2_ = auVar109._4_2_ - sVar53;
        auVar135._6_2_ = auVar109._6_2_ - sVar55;
        auVar135._8_2_ = auVar109._8_2_ - sVar57;
        auVar135._10_2_ = auVar109._10_2_ - sVar59;
        auVar135._12_2_ = auVar109._12_2_ - sVar61;
        auVar135._14_2_ = auVar109._14_2_ - sVar63;
        local_48 = auVar156._0_2_;
        sStack_46 = auVar156._2_2_;
        sStack_44 = auVar156._4_2_;
        sStack_42 = auVar156._6_2_;
        sStack_40 = auVar156._8_2_;
        sStack_3e = auVar156._10_2_;
        sStack_3c = auVar156._12_2_;
        sStack_3a = auVar156._14_2_;
        auVar92._0_2_ = local_48 - sVar88;
        auVar92._2_2_ = sStack_46 - sVar94;
        auVar92._4_2_ = sStack_44 - sVar96;
        auVar92._6_2_ = sStack_42 - sVar98;
        auVar92._8_2_ = sStack_40 - sVar100;
        auVar92._10_2_ = sStack_3e - sVar102;
        auVar92._12_2_ = sStack_3c - sVar104;
        auVar92._14_2_ = sStack_3a - sVar64;
        auVar50 = pabsw(auVar50,auVar135);
        auVar79 = psraw(auVar135,0xf);
        auVar156 = pabsw(auVar69,auVar92);
        local_a8 = (ulong)uVar16;
        uVar21 = auVar50._0_2_;
        auVar82._0_2_ = uVar21 >> local_a8;
        uVar34 = auVar50._2_2_;
        auVar82._2_2_ = uVar34 >> local_a8;
        uVar36 = auVar50._4_2_;
        auVar82._4_2_ = uVar36 >> local_a8;
        uVar38 = auVar50._6_2_;
        auVar82._6_2_ = uVar38 >> local_a8;
        uVar40 = auVar50._8_2_;
        auVar82._8_2_ = uVar40 >> local_a8;
        uVar42 = auVar50._10_2_;
        auVar82._10_2_ = uVar42 >> local_a8;
        uVar44 = auVar50._12_2_;
        uVar46 = auVar50._14_2_;
        auVar82._12_2_ = uVar44 >> local_a8;
        auVar82._14_2_ = uVar46 >> local_a8;
        auVar66 = psraw(auVar92,0xf);
        uVar89 = auVar156._0_2_;
        auVar93._0_2_ = uVar89 >> local_a8;
        uVar95 = auVar156._2_2_;
        auVar93._2_2_ = uVar95 >> local_a8;
        uVar97 = auVar156._4_2_;
        auVar93._4_2_ = uVar97 >> local_a8;
        uVar99 = auVar156._6_2_;
        auVar93._6_2_ = uVar99 >> local_a8;
        uVar101 = auVar156._8_2_;
        auVar93._8_2_ = uVar101 >> local_a8;
        uVar103 = auVar156._10_2_;
        auVar93._10_2_ = uVar103 >> local_a8;
        uVar105 = auVar156._12_2_;
        uVar106 = auVar156._14_2_;
        auVar93._12_2_ = uVar105 >> local_a8;
        auVar93._14_2_ = uVar106 >> local_a8;
        auVar156 = psubusw(auVar139,auVar82);
        auVar109 = psubusw(auVar139,auVar93);
        sVar22 = auVar156._0_2_;
        sVar35 = auVar156._2_2_;
        sVar37 = auVar156._4_2_;
        sVar39 = auVar156._6_2_;
        sVar41 = auVar156._8_2_;
        sVar43 = auVar156._10_2_;
        sVar45 = auVar156._12_2_;
        sVar47 = auVar156._14_2_;
        sVar65 = auVar109._0_2_;
        sVar72 = auVar109._2_2_;
        sVar73 = auVar109._4_2_;
        sVar74 = auVar109._6_2_;
        sVar75 = auVar109._8_2_;
        sVar76 = auVar109._10_2_;
        sVar77 = auVar109._12_2_;
        sVar78 = auVar109._14_2_;
        auVar33._0_2_ =
             (((short)uVar21 < sVar22) * uVar21 | (ushort)((short)uVar21 >= sVar22) * sVar22) +
             auVar79._0_2_;
        auVar33._2_2_ =
             (((short)uVar34 < sVar35) * uVar34 | (ushort)((short)uVar34 >= sVar35) * sVar35) +
             auVar79._2_2_;
        auVar33._4_2_ =
             (((short)uVar36 < sVar37) * uVar36 | (ushort)((short)uVar36 >= sVar37) * sVar37) +
             auVar79._4_2_;
        auVar33._6_2_ =
             (((short)uVar38 < sVar39) * uVar38 | (ushort)((short)uVar38 >= sVar39) * sVar39) +
             auVar79._6_2_;
        auVar33._8_2_ =
             (((short)uVar40 < sVar41) * uVar40 | (ushort)((short)uVar40 >= sVar41) * sVar41) +
             auVar79._8_2_;
        auVar33._10_2_ =
             (((short)uVar42 < sVar43) * uVar42 | (ushort)((short)uVar42 >= sVar43) * sVar43) +
             auVar79._10_2_;
        auVar33._12_2_ =
             (((short)uVar44 < sVar45) * uVar44 | (ushort)((short)uVar44 >= sVar45) * sVar45) +
             auVar79._12_2_;
        auVar33._14_2_ =
             (((short)uVar46 < sVar47) * uVar46 | (ushort)((short)uVar46 >= sVar47) * sVar47) +
             auVar79._14_2_;
        auVar190._0_2_ =
             (((short)uVar89 < sVar65) * uVar89 | (ushort)((short)uVar89 >= sVar65) * sVar65) +
             auVar66._0_2_;
        auVar190._2_2_ =
             (((short)uVar95 < sVar72) * uVar95 | (ushort)((short)uVar95 >= sVar72) * sVar72) +
             auVar66._2_2_;
        auVar190._4_2_ =
             (((short)uVar97 < sVar73) * uVar97 | (ushort)((short)uVar97 >= sVar73) * sVar73) +
             auVar66._4_2_;
        auVar190._6_2_ =
             (((short)uVar99 < sVar74) * uVar99 | (ushort)((short)uVar99 >= sVar74) * sVar74) +
             auVar66._6_2_;
        auVar190._8_2_ =
             (((short)uVar101 < sVar75) * uVar101 | (ushort)((short)uVar101 >= sVar75) * sVar75) +
             auVar66._8_2_;
        auVar190._10_2_ =
             (((short)uVar103 < sVar76) * uVar103 | (ushort)((short)uVar103 >= sVar76) * sVar76) +
             auVar66._10_2_;
        auVar190._12_2_ =
             (((short)uVar105 < sVar77) * uVar105 | (ushort)((short)uVar105 >= sVar77) * sVar77) +
             auVar66._12_2_;
        auVar190._14_2_ =
             (((short)uVar106 < sVar78) * uVar106 | (ushort)((short)uVar106 >= sVar78) * sVar78) +
             auVar66._14_2_;
        auVar33 = auVar33 ^ auVar79;
        auVar190 = auVar190 ^ auVar66;
        auVar182._0_2_ = auVar118._0_2_ - sVar48;
        auVar182._2_2_ = auVar118._2_2_ - sVar51;
        auVar182._4_2_ = auVar118._4_2_ - sVar53;
        auVar182._6_2_ = auVar118._6_2_ - sVar55;
        auVar182._8_2_ = auVar118._8_2_ - sVar57;
        auVar182._10_2_ = auVar118._10_2_ - sVar59;
        auVar182._12_2_ = auVar118._12_2_ - sVar61;
        auVar182._14_2_ = auVar118._14_2_ - sVar63;
        auVar175._0_2_ = auVar107._0_2_ - sVar49;
        auVar175._2_2_ = auVar107._2_2_ - sVar52;
        auVar175._4_2_ = auVar107._4_2_ - sVar54;
        auVar175._6_2_ = auVar107._6_2_ - sVar56;
        auVar175._8_2_ = auVar107._8_2_ - sVar58;
        auVar175._10_2_ = auVar107._10_2_ - sVar60;
        auVar175._12_2_ = auVar107._12_2_ - sVar62;
        auVar175._14_2_ = auVar107._14_2_ - sVar64;
        auVar156 = pabsw(auVar50,auVar182);
        uVar21 = auVar156._0_2_;
        auVar70._0_2_ = uVar21 >> local_a8;
        uVar34 = auVar156._2_2_;
        auVar70._2_2_ = uVar34 >> local_a8;
        uVar36 = auVar156._4_2_;
        auVar70._4_2_ = uVar36 >> local_a8;
        uVar38 = auVar156._6_2_;
        auVar70._6_2_ = uVar38 >> local_a8;
        uVar40 = auVar156._8_2_;
        auVar70._8_2_ = uVar40 >> local_a8;
        uVar42 = auVar156._10_2_;
        auVar70._10_2_ = uVar42 >> local_a8;
        uVar44 = auVar156._12_2_;
        uVar46 = auVar156._14_2_;
        auVar70._12_2_ = uVar44 >> local_a8;
        auVar70._14_2_ = uVar46 >> local_a8;
        auVar156 = pabsw(auVar93,auVar175);
        uVar89 = auVar156._0_2_;
        in_XMM10._0_2_ = uVar89 >> local_a8;
        uVar95 = auVar156._2_2_;
        in_XMM10._2_2_ = uVar95 >> local_a8;
        uVar97 = auVar156._4_2_;
        in_XMM10._4_2_ = uVar97 >> local_a8;
        uVar99 = auVar156._6_2_;
        in_XMM10._6_2_ = uVar99 >> local_a8;
        uVar101 = auVar156._8_2_;
        in_XMM10._8_2_ = uVar101 >> local_a8;
        uVar103 = auVar156._10_2_;
        in_XMM10._10_2_ = uVar103 >> local_a8;
        uVar105 = auVar156._12_2_;
        uVar106 = auVar156._14_2_;
        in_XMM10._12_2_ = uVar105 >> local_a8;
        in_XMM10._14_2_ = uVar106 >> local_a8;
        auVar156 = psubusw(auVar139,auVar70);
        auVar139 = psubusw(auVar139,in_XMM10);
        sVar22 = auVar156._0_2_;
        sVar35 = auVar156._2_2_;
        sVar37 = auVar156._4_2_;
        sVar39 = auVar156._6_2_;
        sVar41 = auVar156._8_2_;
        sVar43 = auVar156._10_2_;
        sVar45 = auVar156._12_2_;
        sVar47 = auVar156._14_2_;
        sVar65 = auVar139._0_2_;
        sVar72 = auVar139._2_2_;
        sVar73 = auVar139._4_2_;
        sVar74 = auVar139._6_2_;
        sVar75 = auVar139._8_2_;
        sVar76 = auVar139._10_2_;
        sVar77 = auVar139._12_2_;
        sVar78 = auVar139._14_2_;
        in_XMM14 = psraw(auVar182,0xf);
        auVar83._0_2_ =
             (((short)uVar21 < sVar22) * uVar21 | (ushort)((short)uVar21 >= sVar22) * sVar22) +
             in_XMM14._0_2_;
        auVar83._2_2_ =
             (((short)uVar34 < sVar35) * uVar34 | (ushort)((short)uVar34 >= sVar35) * sVar35) +
             in_XMM14._2_2_;
        auVar83._4_2_ =
             (((short)uVar36 < sVar37) * uVar36 | (ushort)((short)uVar36 >= sVar37) * sVar37) +
             in_XMM14._4_2_;
        auVar83._6_2_ =
             (((short)uVar38 < sVar39) * uVar38 | (ushort)((short)uVar38 >= sVar39) * sVar39) +
             in_XMM14._6_2_;
        auVar83._8_2_ =
             (((short)uVar40 < sVar41) * uVar40 | (ushort)((short)uVar40 >= sVar41) * sVar41) +
             in_XMM14._8_2_;
        auVar83._10_2_ =
             (((short)uVar42 < sVar43) * uVar42 | (ushort)((short)uVar42 >= sVar43) * sVar43) +
             in_XMM14._10_2_;
        auVar83._12_2_ =
             (((short)uVar44 < sVar45) * uVar44 | (ushort)((short)uVar44 >= sVar45) * sVar45) +
             in_XMM14._12_2_;
        auVar83._14_2_ =
             (((short)uVar46 < sVar47) * uVar46 | (ushort)((short)uVar46 >= sVar47) * sVar47) +
             in_XMM14._14_2_;
        auVar83 = auVar83 ^ in_XMM14;
        in_XMM13 = psraw(auVar175,0xf);
        auVar124._0_2_ =
             (((short)uVar89 < sVar65) * uVar89 | (ushort)((short)uVar89 >= sVar65) * sVar65) +
             in_XMM13._0_2_;
        auVar124._2_2_ =
             (((short)uVar95 < sVar72) * uVar95 | (ushort)((short)uVar95 >= sVar72) * sVar72) +
             in_XMM13._2_2_;
        auVar124._4_2_ =
             (((short)uVar97 < sVar73) * uVar97 | (ushort)((short)uVar97 >= sVar73) * sVar73) +
             in_XMM13._4_2_;
        auVar124._6_2_ =
             (((short)uVar99 < sVar74) * uVar99 | (ushort)((short)uVar99 >= sVar74) * sVar74) +
             in_XMM13._6_2_;
        auVar124._8_2_ =
             (((short)uVar101 < sVar75) * uVar101 | (ushort)((short)uVar101 >= sVar75) * sVar75) +
             in_XMM13._8_2_;
        auVar124._10_2_ =
             (((short)uVar103 < sVar76) * uVar103 | (ushort)((short)uVar103 >= sVar76) * sVar76) +
             in_XMM13._10_2_;
        auVar124._12_2_ =
             (((short)uVar105 < sVar77) * uVar105 | (ushort)((short)uVar105 >= sVar77) * sVar77) +
             in_XMM13._12_2_;
        auVar124._14_2_ =
             (((short)uVar106 < sVar78) * uVar106 | (ushort)((short)uVar106 >= sVar78) * sVar78) +
             in_XMM13._14_2_;
        auVar124 = auVar124 ^ in_XMM13;
        local_58 = auVar25._0_2_;
        sStack_56 = auVar25._2_2_;
        in_XMM8._0_2_ = (auVar120._0_2_ + auVar68._0_2_ + auVar160._0_2_) * local_58;
        in_XMM8._2_2_ = (auVar120._2_2_ + auVar68._2_2_ + auVar160._2_2_) * sStack_56;
        in_XMM8._4_2_ = (auVar120._4_2_ + auVar68._4_2_ + auVar160._4_2_) * local_58;
        in_XMM8._6_2_ = (auVar120._6_2_ + auVar68._6_2_ + auVar160._6_2_) * sStack_56;
        in_XMM8._8_2_ = (auVar120._8_2_ + auVar68._8_2_ + auVar160._8_2_) * local_58;
        in_XMM8._10_2_ = (auVar120._10_2_ + auVar68._10_2_ + auVar160._10_2_) * sStack_56;
        in_XMM8._12_2_ = (auVar120._12_2_ + auVar68._12_2_ + auVar160._12_2_) * local_58;
        in_XMM8._14_2_ = (auVar120._14_2_ + auVar68._14_2_ + auVar160._14_2_) * sStack_56;
        auVar12._4_4_ = uVar24;
        auVar12._0_4_ = uVar24;
        auVar12._8_4_ = uVar24;
        auVar12._12_4_ = uVar24;
        sVar22 = auVar26._0_2_;
        sVar35 = auVar26._2_2_;
        auVar84._0_2_ = (auVar83._0_2_ + auVar33._0_2_ + in_XMM12._0_2_) * sVar22 + in_XMM8._0_2_;
        auVar84._2_2_ = (auVar83._2_2_ + auVar33._2_2_ + in_XMM12._2_2_) * sVar35 + in_XMM8._2_2_;
        auVar84._4_2_ = (auVar83._4_2_ + auVar33._4_2_ + in_XMM12._4_2_) * sVar22 + in_XMM8._4_2_;
        auVar84._6_2_ = (auVar83._6_2_ + auVar33._6_2_ + in_XMM12._6_2_) * sVar35 + in_XMM8._6_2_;
        auVar84._8_2_ = (auVar83._8_2_ + auVar33._8_2_ + in_XMM12._8_2_) * sVar22 + in_XMM8._8_2_;
        auVar84._10_2_ =
             (auVar83._10_2_ + auVar33._10_2_ + in_XMM12._10_2_) * sVar35 + in_XMM8._10_2_;
        auVar84._12_2_ =
             (auVar83._12_2_ + auVar33._12_2_ + in_XMM12._12_2_) * sVar22 + in_XMM8._12_2_;
        auVar84._14_2_ =
             (auVar83._14_2_ + auVar33._14_2_ + in_XMM12._14_2_) * sVar35 + in_XMM8._14_2_;
        in_XMM7._0_2_ = (auVar112._0_2_ + auVar30._0_2_ + auVar144._0_2_) * local_58;
        in_XMM7._2_2_ = (auVar112._2_2_ + auVar30._2_2_ + auVar144._2_2_) * sStack_56;
        in_XMM7._4_2_ = (auVar112._4_2_ + auVar30._4_2_ + auVar144._4_2_) * local_58;
        in_XMM7._6_2_ = (auVar112._6_2_ + auVar30._6_2_ + auVar144._6_2_) * sStack_56;
        in_XMM7._8_2_ = (auVar112._8_2_ + auVar30._8_2_ + auVar144._8_2_) * local_58;
        in_XMM7._10_2_ = (auVar112._10_2_ + auVar30._10_2_ + auVar144._10_2_) * sStack_56;
        in_XMM7._12_2_ = (auVar112._12_2_ + auVar30._12_2_ + auVar144._12_2_) * local_58;
        in_XMM7._14_2_ = (auVar112._14_2_ + auVar30._14_2_ + auVar144._14_2_) * sStack_56;
        auVar125._0_2_ = (auVar124._0_2_ + auVar190._0_2_ + in_XMM11._0_2_) * sVar22 + in_XMM7._0_2_
        ;
        auVar125._2_2_ = (auVar124._2_2_ + auVar190._2_2_ + in_XMM11._2_2_) * sVar35 + in_XMM7._2_2_
        ;
        auVar125._4_2_ = (auVar124._4_2_ + auVar190._4_2_ + in_XMM11._4_2_) * sVar22 + in_XMM7._4_2_
        ;
        auVar125._6_2_ = (auVar124._6_2_ + auVar190._6_2_ + in_XMM11._6_2_) * sVar35 + in_XMM7._6_2_
        ;
        auVar125._8_2_ = (auVar124._8_2_ + auVar190._8_2_ + in_XMM11._8_2_) * sVar22 + in_XMM7._8_2_
        ;
        auVar125._10_2_ =
             (auVar124._10_2_ + auVar190._10_2_ + in_XMM11._10_2_) * sVar35 + in_XMM7._10_2_;
        auVar125._12_2_ =
             (auVar124._12_2_ + auVar190._12_2_ + in_XMM11._12_2_) * sVar22 + in_XMM7._12_2_;
        auVar125._14_2_ =
             (auVar124._14_2_ + auVar190._14_2_ + in_XMM11._14_2_) * sVar35 + in_XMM7._14_2_;
        auVar139 = psraw(auVar84,0xf);
        auVar156 = pmovsxbw(auVar12,0x808080808080808);
        auVar85._0_2_ = auVar84._0_2_ + auVar156._0_2_ + auVar139._0_2_;
        auVar85._2_2_ = auVar84._2_2_ + auVar156._2_2_ + auVar139._2_2_;
        auVar85._4_2_ = auVar84._4_2_ + auVar156._4_2_ + auVar139._4_2_;
        auVar85._6_2_ = auVar84._6_2_ + auVar156._6_2_ + auVar139._6_2_;
        auVar85._8_2_ = auVar84._8_2_ + auVar156._8_2_ + auVar139._8_2_;
        auVar85._10_2_ = auVar84._10_2_ + auVar156._10_2_ + auVar139._10_2_;
        auVar85._12_2_ = auVar84._12_2_ + auVar156._12_2_ + auVar139._12_2_;
        auVar85._14_2_ = auVar84._14_2_ + auVar156._14_2_ + auVar139._14_2_;
        auVar139 = psraw(auVar125,0xf);
        auVar126._0_2_ = auVar125._0_2_ + auVar156._0_2_ + auVar139._0_2_;
        auVar126._2_2_ = auVar125._2_2_ + auVar156._2_2_ + auVar139._2_2_;
        auVar126._4_2_ = auVar125._4_2_ + auVar156._4_2_ + auVar139._4_2_;
        auVar126._6_2_ = auVar125._6_2_ + auVar156._6_2_ + auVar139._6_2_;
        auVar126._8_2_ = auVar125._8_2_ + auVar156._8_2_ + auVar139._8_2_;
        auVar126._10_2_ = auVar125._10_2_ + auVar156._10_2_ + auVar139._10_2_;
        auVar126._12_2_ = auVar125._12_2_ + auVar156._12_2_ + auVar139._12_2_;
        auVar126._14_2_ = auVar125._14_2_ + auVar156._14_2_ + auVar139._14_2_;
        auVar139 = psraw(auVar85,4);
        in_XMM4._0_2_ = auVar139._0_2_ + sVar48;
        in_XMM4._2_2_ = auVar139._2_2_ + sVar51;
        in_XMM4._4_2_ = auVar139._4_2_ + sVar53;
        in_XMM4._6_2_ = auVar139._6_2_ + sVar55;
        in_XMM4._8_2_ = auVar139._8_2_ + sVar57;
        in_XMM4._10_2_ = auVar139._10_2_ + sVar59;
        in_XMM4._12_2_ = auVar139._12_2_ + sVar61;
        in_XMM4._14_2_ = auVar139._14_2_ + sVar63;
        auVar139 = psraw(auVar126,4);
        *(undefined1 (*) [16])dest = in_XMM4;
        psVar2 = (short *)((long)*(undefined1 (*) [16])dest + (long)dstride * 2);
        *psVar2 = auVar139._0_2_ + sVar49;
        psVar2[1] = auVar139._2_2_ + sVar52;
        psVar2[2] = auVar139._4_2_ + sVar54;
        psVar2[3] = auVar139._6_2_ + sVar56;
        psVar2[4] = auVar139._8_2_ + sVar58;
        psVar2[5] = auVar139._10_2_ + sVar60;
        psVar2[6] = auVar139._12_2_ + sVar62;
        psVar2[7] = auVar139._14_2_ + sVar64;
        uVar19 = uVar19 + 2;
        in = (uint16_t *)((long)in + 0x240);
        dest = (void *)((long)*(undefined1 (*) [16])dest + (long)dstride * 4);
        in_XMM6 = auVar71;
      } while (uVar19 < (uint)block_height);
    }
  }
  else {
    uVar16 = sec_damping;
    if (sec_strength != 0) {
      iVar11 = 0x1f;
      if (sec_strength != 0) {
        for (; (uint)sec_strength >> iVar11 == 0; iVar11 = iVar11 + -1) {
        }
      }
      uVar16 = sec_damping - iVar11;
      if (sec_damping < iVar11) {
        uVar16 = 0;
      }
    }
    if (0 < block_height) {
      auVar25 = pshuflw(ZEXT416((uint)sec_strength),ZEXT416((uint)sec_strength),0);
      auVar26._0_4_ = auVar25._0_4_;
      auVar26._4_4_ = auVar26._0_4_;
      auVar26._8_4_ = auVar26._0_4_;
      auVar26._12_4_ = auVar26._0_4_;
      auVar71 = pshuflw(ZEXT416((uint)2),ZEXT416((uint)2),0);
      auVar139 = pshuflw(ZEXT416((uint)1),ZEXT416((uint)1),0);
      sStack_94 = auVar139._0_2_;
      sStack_92 = auVar139._2_2_;
      lVar17 = (long)dstride;
      uVar19 = 0;
      auVar25 = auVar71;
      do {
        uVar3 = *(undefined8 *)in;
        uVar4 = *(undefined8 *)(in + 0x90);
        uVar5 = *(undefined8 *)(in + 0x120);
        uVar6 = *(undefined8 *)(in + 0x1b0);
        auVar156._8_8_ = uVar5;
        auVar156._0_8_ = uVar6;
        uVar7 = *(undefined8 *)(in + lVar14);
        uVar8 = *(undefined8 *)(in + lVar14 + 0x90);
        uVar9 = *(undefined8 *)(in + lVar14 + 0x120);
        uVar10 = *(undefined8 *)(in + lVar14 + 0x1b0);
        sVar22 = (short)uVar4;
        auVar118._0_2_ = (short)uVar8 - sVar22;
        sVar35 = (short)((ulong)uVar4 >> 0x10);
        auVar118._2_2_ = (short)((ulong)uVar8 >> 0x10) - sVar35;
        sVar37 = (short)((ulong)uVar4 >> 0x20);
        auVar118._4_2_ = (short)((ulong)uVar8 >> 0x20) - sVar37;
        sVar39 = (short)((ulong)uVar4 >> 0x30);
        auVar118._6_2_ = (short)((ulong)uVar8 >> 0x30) - sVar39;
        sVar41 = (short)uVar3;
        auVar118._8_2_ = (short)uVar7 - sVar41;
        sVar43 = (short)((ulong)uVar3 >> 0x10);
        auVar118._10_2_ = (short)((ulong)uVar7 >> 0x10) - sVar43;
        sVar45 = (short)((ulong)uVar3 >> 0x20);
        auVar118._12_2_ = (short)((ulong)uVar7 >> 0x20) - sVar45;
        sVar47 = (short)((ulong)uVar3 >> 0x30);
        auVar118._14_2_ = (short)((ulong)uVar7 >> 0x30) - sVar47;
        sVar49 = (short)uVar6;
        auVar127._0_2_ = (short)uVar10 - sVar49;
        sVar52 = (short)((ulong)uVar6 >> 0x10);
        auVar127._2_2_ = (short)((ulong)uVar10 >> 0x10) - sVar52;
        sVar54 = (short)((ulong)uVar6 >> 0x20);
        auVar127._4_2_ = (short)((ulong)uVar10 >> 0x20) - sVar54;
        sVar56 = (short)((ulong)uVar6 >> 0x30);
        auVar127._6_2_ = (short)((ulong)uVar10 >> 0x30) - sVar56;
        sVar58 = (short)uVar5;
        auVar127._8_2_ = (short)uVar9 - sVar58;
        sVar60 = (short)((ulong)uVar5 >> 0x10);
        auVar127._10_2_ = (short)((ulong)uVar9 >> 0x10) - sVar60;
        sVar62 = (short)((ulong)uVar5 >> 0x20);
        auVar127._12_2_ = (short)((ulong)uVar9 >> 0x20) - sVar62;
        sVar64 = (short)((ulong)uVar5 >> 0x30);
        auVar127._14_2_ = (short)((ulong)uVar9 >> 0x30) - sVar64;
        auVar66 = pabsw(in_XMM10,auVar118);
        auVar50 = psraw(auVar118,0xf);
        auVar79 = pabsw(in_XMM11,auVar127);
        auVar107 = psraw(auVar127,0xf);
        uVar90 = (ulong)uVar16;
        uVar21 = auVar66._0_2_;
        auVar113._0_2_ = uVar21 >> uVar90;
        uVar34 = auVar66._2_2_;
        auVar113._2_2_ = uVar34 >> uVar90;
        uVar36 = auVar66._4_2_;
        auVar113._4_2_ = uVar36 >> uVar90;
        uVar38 = auVar66._6_2_;
        auVar113._6_2_ = uVar38 >> uVar90;
        uVar40 = auVar66._8_2_;
        auVar113._8_2_ = uVar40 >> uVar90;
        uVar42 = auVar66._10_2_;
        auVar113._10_2_ = uVar42 >> uVar90;
        uVar44 = auVar66._12_2_;
        uVar46 = auVar66._14_2_;
        auVar113._12_2_ = uVar44 >> uVar90;
        auVar113._14_2_ = uVar46 >> uVar90;
        uVar89 = auVar79._0_2_;
        auVar163._0_2_ = uVar89 >> uVar90;
        uVar95 = auVar79._2_2_;
        auVar163._2_2_ = uVar95 >> uVar90;
        uVar97 = auVar79._4_2_;
        auVar163._4_2_ = uVar97 >> uVar90;
        uVar99 = auVar79._6_2_;
        auVar163._6_2_ = uVar99 >> uVar90;
        uVar101 = auVar79._8_2_;
        auVar163._8_2_ = uVar101 >> uVar90;
        uVar103 = auVar79._10_2_;
        auVar163._10_2_ = uVar103 >> uVar90;
        uVar105 = auVar79._12_2_;
        uVar106 = auVar79._14_2_;
        auVar163._12_2_ = uVar105 >> uVar90;
        auVar163._14_2_ = uVar106 >> uVar90;
        auVar79 = psubusw(auVar26,auVar113);
        auVar66 = psubusw(auVar26,auVar163);
        sVar65 = auVar79._0_2_;
        sVar72 = auVar79._2_2_;
        sVar73 = auVar79._4_2_;
        sVar74 = auVar79._6_2_;
        sVar75 = auVar79._8_2_;
        sVar76 = auVar79._10_2_;
        sVar77 = auVar79._12_2_;
        sVar78 = auVar79._14_2_;
        sVar48 = auVar66._0_2_;
        sVar51 = auVar66._2_2_;
        sVar53 = auVar66._4_2_;
        sVar55 = auVar66._6_2_;
        sVar57 = auVar66._8_2_;
        sVar59 = auVar66._10_2_;
        sVar61 = auVar66._12_2_;
        sVar63 = auVar66._14_2_;
        auVar121._0_2_ =
             (((short)uVar21 < sVar65) * uVar21 | (ushort)((short)uVar21 >= sVar65) * sVar65) +
             auVar50._0_2_;
        auVar121._2_2_ =
             (((short)uVar34 < sVar72) * uVar34 | (ushort)((short)uVar34 >= sVar72) * sVar72) +
             auVar50._2_2_;
        auVar121._4_2_ =
             (((short)uVar36 < sVar73) * uVar36 | (ushort)((short)uVar36 >= sVar73) * sVar73) +
             auVar50._4_2_;
        auVar121._6_2_ =
             (((short)uVar38 < sVar74) * uVar38 | (ushort)((short)uVar38 >= sVar74) * sVar74) +
             auVar50._6_2_;
        auVar121._8_2_ =
             (((short)uVar40 < sVar75) * uVar40 | (ushort)((short)uVar40 >= sVar75) * sVar75) +
             auVar50._8_2_;
        auVar121._10_2_ =
             (((short)uVar42 < sVar76) * uVar42 | (ushort)((short)uVar42 >= sVar76) * sVar76) +
             auVar50._10_2_;
        auVar121._12_2_ =
             (((short)uVar44 < sVar77) * uVar44 | (ushort)((short)uVar44 >= sVar77) * sVar77) +
             auVar50._12_2_;
        auVar121._14_2_ =
             (((short)uVar46 < sVar78) * uVar46 | (ushort)((short)uVar46 >= sVar78) * sVar78) +
             auVar50._14_2_;
        auVar114._0_2_ =
             (((short)uVar89 < sVar48) * uVar89 | (ushort)((short)uVar89 >= sVar48) * sVar48) +
             auVar107._0_2_;
        auVar114._2_2_ =
             (((short)uVar95 < sVar51) * uVar95 | (ushort)((short)uVar95 >= sVar51) * sVar51) +
             auVar107._2_2_;
        auVar114._4_2_ =
             (((short)uVar97 < sVar53) * uVar97 | (ushort)((short)uVar97 >= sVar53) * sVar53) +
             auVar107._4_2_;
        auVar114._6_2_ =
             (((short)uVar99 < sVar55) * uVar99 | (ushort)((short)uVar99 >= sVar55) * sVar55) +
             auVar107._6_2_;
        auVar114._8_2_ =
             (((short)uVar101 < sVar57) * uVar101 | (ushort)((short)uVar101 >= sVar57) * sVar57) +
             auVar107._8_2_;
        auVar114._10_2_ =
             (((short)uVar103 < sVar59) * uVar103 | (ushort)((short)uVar103 >= sVar59) * sVar59) +
             auVar107._10_2_;
        auVar114._12_2_ =
             (((short)uVar105 < sVar61) * uVar105 | (ushort)((short)uVar105 >= sVar61) * sVar61) +
             auVar107._12_2_;
        auVar114._14_2_ =
             (((short)uVar106 < sVar63) * uVar106 | (ushort)((short)uVar106 >= sVar63) * sVar63) +
             auVar107._14_2_;
        auVar121 = auVar121 ^ auVar50;
        auVar114 = auVar114 ^ auVar107;
        uVar3 = *(undefined8 *)(in + -lVar14);
        uVar4 = *(undefined8 *)(in + (0x90 - lVar14));
        uVar5 = *(undefined8 *)(in + (0x120 - lVar14));
        uVar6 = *(undefined8 *)(in + (0x1b0 - lVar14));
        auVar133._0_2_ = (short)uVar4 - sVar22;
        auVar133._2_2_ = (short)((ulong)uVar4 >> 0x10) - sVar35;
        auVar133._4_2_ = (short)((ulong)uVar4 >> 0x20) - sVar37;
        auVar133._6_2_ = (short)((ulong)uVar4 >> 0x30) - sVar39;
        auVar133._8_2_ = (short)uVar3 - sVar41;
        auVar133._10_2_ = (short)((ulong)uVar3 >> 0x10) - sVar43;
        auVar133._12_2_ = (short)((ulong)uVar3 >> 0x20) - sVar45;
        auVar133._14_2_ = (short)((ulong)uVar3 >> 0x30) - sVar47;
        auVar148._0_2_ = (short)uVar6 - sVar49;
        auVar148._2_2_ = (short)((ulong)uVar6 >> 0x10) - sVar52;
        auVar148._4_2_ = (short)((ulong)uVar6 >> 0x20) - sVar54;
        auVar148._6_2_ = (short)((ulong)uVar6 >> 0x30) - sVar56;
        auVar148._8_2_ = (short)uVar5 - sVar58;
        auVar148._10_2_ = (short)((ulong)uVar5 >> 0x10) - sVar60;
        auVar148._12_2_ = (short)((ulong)uVar5 >> 0x20) - sVar62;
        auVar148._14_2_ = (short)((ulong)uVar5 >> 0x30) - sVar64;
        auVar66 = pabsw(auVar163,auVar133);
        auVar50 = psraw(auVar133,0xf);
        auVar109 = pabsw(in_XMM13,auVar148);
        auVar107 = psraw(auVar148,0xf);
        uVar91 = (ulong)uVar16;
        uVar21 = auVar66._0_2_;
        auVar128._0_2_ = uVar21 >> uVar91;
        uVar34 = auVar66._2_2_;
        auVar128._2_2_ = uVar34 >> uVar91;
        uVar36 = auVar66._4_2_;
        auVar128._4_2_ = uVar36 >> uVar91;
        uVar38 = auVar66._6_2_;
        auVar128._6_2_ = uVar38 >> uVar91;
        uVar40 = auVar66._8_2_;
        auVar128._8_2_ = uVar40 >> uVar91;
        uVar42 = auVar66._10_2_;
        auVar128._10_2_ = uVar42 >> uVar91;
        uVar44 = auVar66._12_2_;
        uVar46 = auVar66._14_2_;
        auVar128._12_2_ = uVar44 >> uVar91;
        auVar128._14_2_ = uVar46 >> uVar91;
        uVar89 = auVar109._0_2_;
        auVar183._0_2_ = uVar89 >> uVar91;
        uVar95 = auVar109._2_2_;
        auVar183._2_2_ = uVar95 >> uVar91;
        uVar97 = auVar109._4_2_;
        auVar183._4_2_ = uVar97 >> uVar91;
        uVar99 = auVar109._6_2_;
        auVar183._6_2_ = uVar99 >> uVar91;
        uVar101 = auVar109._8_2_;
        auVar183._8_2_ = uVar101 >> uVar91;
        uVar103 = auVar109._10_2_;
        auVar183._10_2_ = uVar103 >> uVar91;
        uVar105 = auVar109._12_2_;
        uVar106 = auVar109._14_2_;
        auVar183._12_2_ = uVar105 >> uVar91;
        auVar183._14_2_ = uVar106 >> uVar91;
        auVar79 = psubusw(auVar26,auVar128);
        auVar66 = psubusw(auVar26,auVar183);
        sVar65 = auVar79._0_2_;
        sVar72 = auVar79._2_2_;
        sVar73 = auVar79._4_2_;
        sVar74 = auVar79._6_2_;
        sVar75 = auVar79._8_2_;
        sVar76 = auVar79._10_2_;
        sVar77 = auVar79._12_2_;
        sVar78 = auVar79._14_2_;
        sVar48 = auVar66._0_2_;
        sVar51 = auVar66._2_2_;
        sVar53 = auVar66._4_2_;
        sVar55 = auVar66._6_2_;
        sVar57 = auVar66._8_2_;
        sVar59 = auVar66._10_2_;
        sVar61 = auVar66._12_2_;
        sVar63 = auVar66._14_2_;
        auVar136._0_2_ =
             (((short)uVar21 < sVar65) * uVar21 | (ushort)((short)uVar21 >= sVar65) * sVar65) +
             auVar50._0_2_;
        auVar136._2_2_ =
             (((short)uVar34 < sVar72) * uVar34 | (ushort)((short)uVar34 >= sVar72) * sVar72) +
             auVar50._2_2_;
        auVar136._4_2_ =
             (((short)uVar36 < sVar73) * uVar36 | (ushort)((short)uVar36 >= sVar73) * sVar73) +
             auVar50._4_2_;
        auVar136._6_2_ =
             (((short)uVar38 < sVar74) * uVar38 | (ushort)((short)uVar38 >= sVar74) * sVar74) +
             auVar50._6_2_;
        auVar136._8_2_ =
             (((short)uVar40 < sVar75) * uVar40 | (ushort)((short)uVar40 >= sVar75) * sVar75) +
             auVar50._8_2_;
        auVar136._10_2_ =
             (((short)uVar42 < sVar76) * uVar42 | (ushort)((short)uVar42 >= sVar76) * sVar76) +
             auVar50._10_2_;
        auVar136._12_2_ =
             (((short)uVar44 < sVar77) * uVar44 | (ushort)((short)uVar44 >= sVar77) * sVar77) +
             auVar50._12_2_;
        auVar136._14_2_ =
             (((short)uVar46 < sVar78) * uVar46 | (ushort)((short)uVar46 >= sVar78) * sVar78) +
             auVar50._14_2_;
        auVar129._0_2_ =
             (((short)uVar89 < sVar48) * uVar89 | (ushort)((short)uVar89 >= sVar48) * sVar48) +
             auVar107._0_2_;
        auVar129._2_2_ =
             (((short)uVar95 < sVar51) * uVar95 | (ushort)((short)uVar95 >= sVar51) * sVar51) +
             auVar107._2_2_;
        auVar129._4_2_ =
             (((short)uVar97 < sVar53) * uVar97 | (ushort)((short)uVar97 >= sVar53) * sVar53) +
             auVar107._4_2_;
        auVar129._6_2_ =
             (((short)uVar99 < sVar55) * uVar99 | (ushort)((short)uVar99 >= sVar55) * sVar55) +
             auVar107._6_2_;
        auVar129._8_2_ =
             (((short)uVar101 < sVar57) * uVar101 | (ushort)((short)uVar101 >= sVar57) * sVar57) +
             auVar107._8_2_;
        auVar129._10_2_ =
             (((short)uVar103 < sVar59) * uVar103 | (ushort)((short)uVar103 >= sVar59) * sVar59) +
             auVar107._10_2_;
        auVar129._12_2_ =
             (((short)uVar105 < sVar61) * uVar105 | (ushort)((short)uVar105 >= sVar61) * sVar61) +
             auVar107._12_2_;
        auVar129._14_2_ =
             (((short)uVar106 < sVar63) * uVar106 | (ushort)((short)uVar106 >= sVar63) * sVar63) +
             auVar107._14_2_;
        auVar136 = auVar136 ^ auVar50;
        auVar129 = auVar129 ^ auVar107;
        uVar3 = *(undefined8 *)(in + lVar18);
        uVar4 = *(undefined8 *)(in + lVar18 + 0x90);
        uVar90 = *(ulong *)(in + lVar18 + 0x120);
        auVar122._8_8_ = 0;
        auVar122._0_8_ = uVar90;
        uVar5 = *(undefined8 *)(in + lVar18 + 0x1b0);
        auVar141._0_2_ = (short)uVar4 - sVar22;
        auVar141._2_2_ = (short)((ulong)uVar4 >> 0x10) - sVar35;
        auVar141._4_2_ = (short)((ulong)uVar4 >> 0x20) - sVar37;
        auVar141._6_2_ = (short)((ulong)uVar4 >> 0x30) - sVar39;
        auVar141._8_2_ = (short)uVar3 - sVar41;
        auVar141._10_2_ = (short)((ulong)uVar3 >> 0x10) - sVar43;
        auVar141._12_2_ = (short)((ulong)uVar3 >> 0x20) - sVar45;
        auVar141._14_2_ = (short)((ulong)uVar3 >> 0x30) - sVar47;
        auVar115._0_2_ = (short)uVar5 - sVar49;
        auVar115._2_2_ = (short)((ulong)uVar5 >> 0x10) - sVar52;
        auVar115._4_2_ = (short)((ulong)uVar5 >> 0x20) - sVar54;
        auVar115._6_2_ = (short)((ulong)uVar5 >> 0x30) - sVar56;
        auVar115._8_2_ = (short)uVar90 - sVar58;
        auVar115._10_2_ = (short)(uVar90 >> 0x10) - sVar60;
        auVar115._12_2_ = (short)(uVar90 >> 0x20) - sVar62;
        auVar115._14_2_ = (short)(uVar90 >> 0x30) - sVar64;
        auVar66 = pabsw(auVar122,auVar141);
        auVar50 = psraw(auVar141,0xf);
        uVar21 = auVar66._0_2_;
        auVar149._0_2_ = uVar21 >> uVar91;
        uVar34 = auVar66._2_2_;
        auVar149._2_2_ = uVar34 >> uVar91;
        uVar36 = auVar66._4_2_;
        auVar149._4_2_ = uVar36 >> uVar91;
        uVar38 = auVar66._6_2_;
        auVar149._6_2_ = uVar38 >> uVar91;
        uVar40 = auVar66._8_2_;
        auVar149._8_2_ = uVar40 >> uVar91;
        uVar42 = auVar66._10_2_;
        auVar149._10_2_ = uVar42 >> uVar91;
        uVar44 = auVar66._12_2_;
        uVar46 = auVar66._14_2_;
        auVar149._12_2_ = uVar44 >> uVar91;
        auVar149._14_2_ = uVar46 >> uVar91;
        auVar66 = pabsw(auVar109,auVar115);
        uVar89 = auVar66._0_2_;
        auVar184._0_2_ = uVar89 >> uVar91;
        uVar95 = auVar66._2_2_;
        auVar184._2_2_ = uVar95 >> uVar91;
        uVar97 = auVar66._4_2_;
        auVar184._4_2_ = uVar97 >> uVar91;
        uVar99 = auVar66._6_2_;
        auVar184._6_2_ = uVar99 >> uVar91;
        uVar101 = auVar66._8_2_;
        auVar184._8_2_ = uVar101 >> uVar91;
        uVar103 = auVar66._10_2_;
        auVar184._10_2_ = uVar103 >> uVar91;
        uVar105 = auVar66._12_2_;
        uVar106 = auVar66._14_2_;
        auVar184._12_2_ = uVar105 >> uVar91;
        auVar184._14_2_ = uVar106 >> uVar91;
        auVar66 = psraw(auVar115,0xf);
        auVar107 = psubusw(auVar26,auVar149);
        auVar79 = psubusw(auVar26,auVar184);
        sVar65 = auVar107._0_2_;
        sVar72 = auVar107._2_2_;
        sVar73 = auVar107._4_2_;
        sVar74 = auVar107._6_2_;
        sVar75 = auVar107._8_2_;
        sVar76 = auVar107._10_2_;
        sVar77 = auVar107._12_2_;
        sVar78 = auVar107._14_2_;
        sVar48 = auVar79._0_2_;
        sVar51 = auVar79._2_2_;
        sVar53 = auVar79._4_2_;
        sVar55 = auVar79._6_2_;
        sVar57 = auVar79._8_2_;
        sVar59 = auVar79._10_2_;
        sVar61 = auVar79._12_2_;
        sVar63 = auVar79._14_2_;
        auVar164._0_2_ =
             (((short)uVar21 < sVar65) * uVar21 | (ushort)((short)uVar21 >= sVar65) * sVar65) +
             auVar50._0_2_;
        auVar164._2_2_ =
             (((short)uVar34 < sVar72) * uVar34 | (ushort)((short)uVar34 >= sVar72) * sVar72) +
             auVar50._2_2_;
        auVar164._4_2_ =
             (((short)uVar36 < sVar73) * uVar36 | (ushort)((short)uVar36 >= sVar73) * sVar73) +
             auVar50._4_2_;
        auVar164._6_2_ =
             (((short)uVar38 < sVar74) * uVar38 | (ushort)((short)uVar38 >= sVar74) * sVar74) +
             auVar50._6_2_;
        auVar164._8_2_ =
             (((short)uVar40 < sVar75) * uVar40 | (ushort)((short)uVar40 >= sVar75) * sVar75) +
             auVar50._8_2_;
        auVar164._10_2_ =
             (((short)uVar42 < sVar76) * uVar42 | (ushort)((short)uVar42 >= sVar76) * sVar76) +
             auVar50._10_2_;
        auVar164._12_2_ =
             (((short)uVar44 < sVar77) * uVar44 | (ushort)((short)uVar44 >= sVar77) * sVar77) +
             auVar50._12_2_;
        auVar164._14_2_ =
             (((short)uVar46 < sVar78) * uVar46 | (ushort)((short)uVar46 >= sVar78) * sVar78) +
             auVar50._14_2_;
        auVar150._0_2_ =
             (((short)uVar89 < sVar48) * uVar89 | (ushort)((short)uVar89 >= sVar48) * sVar48) +
             auVar66._0_2_;
        auVar150._2_2_ =
             (((short)uVar95 < sVar51) * uVar95 | (ushort)((short)uVar95 >= sVar51) * sVar51) +
             auVar66._2_2_;
        auVar150._4_2_ =
             (((short)uVar97 < sVar53) * uVar97 | (ushort)((short)uVar97 >= sVar53) * sVar53) +
             auVar66._4_2_;
        auVar150._6_2_ =
             (((short)uVar99 < sVar55) * uVar99 | (ushort)((short)uVar99 >= sVar55) * sVar55) +
             auVar66._6_2_;
        auVar150._8_2_ =
             (((short)uVar101 < sVar57) * uVar101 | (ushort)((short)uVar101 >= sVar57) * sVar57) +
             auVar66._8_2_;
        auVar150._10_2_ =
             (((short)uVar103 < sVar59) * uVar103 | (ushort)((short)uVar103 >= sVar59) * sVar59) +
             auVar66._10_2_;
        auVar150._12_2_ =
             (((short)uVar105 < sVar61) * uVar105 | (ushort)((short)uVar105 >= sVar61) * sVar61) +
             auVar66._12_2_;
        auVar150._14_2_ =
             (((short)uVar106 < sVar63) * uVar106 | (ushort)((short)uVar106 >= sVar63) * sVar63) +
             auVar66._14_2_;
        auVar164 = auVar164 ^ auVar50;
        auVar150 = auVar150 ^ auVar66;
        uVar3 = *(undefined8 *)(in + -lVar18);
        uVar4 = *(undefined8 *)(in + (0x90 - lVar18));
        uVar5 = *(undefined8 *)(in + (0x120 - lVar18));
        uVar6 = *(undefined8 *)(in + (0x1b0 - lVar18));
        auVar158._0_2_ = (short)uVar4 - sVar22;
        auVar158._2_2_ = (short)((ulong)uVar4 >> 0x10) - sVar35;
        auVar158._4_2_ = (short)((ulong)uVar4 >> 0x20) - sVar37;
        auVar158._6_2_ = (short)((ulong)uVar4 >> 0x30) - sVar39;
        auVar158._8_2_ = (short)uVar3 - sVar41;
        auVar158._10_2_ = (short)((ulong)uVar3 >> 0x10) - sVar43;
        auVar158._12_2_ = (short)((ulong)uVar3 >> 0x20) - sVar45;
        auVar158._14_2_ = (short)((ulong)uVar3 >> 0x30) - sVar47;
        auVar176._0_2_ = (short)uVar6 - sVar49;
        auVar176._2_2_ = (short)((ulong)uVar6 >> 0x10) - sVar52;
        auVar176._4_2_ = (short)((ulong)uVar6 >> 0x20) - sVar54;
        auVar176._6_2_ = (short)((ulong)uVar6 >> 0x30) - sVar56;
        auVar176._8_2_ = (short)uVar5 - sVar58;
        auVar176._10_2_ = (short)((ulong)uVar5 >> 0x10) - sVar60;
        auVar176._12_2_ = (short)((ulong)uVar5 >> 0x20) - sVar62;
        auVar176._14_2_ = (short)((ulong)uVar5 >> 0x30) - sVar64;
        auVar66 = pabsw(auVar184,auVar158);
        auVar50 = psraw(auVar158,0xf);
        uVar91 = (ulong)uVar16;
        uVar21 = auVar66._0_2_;
        auVar116._0_2_ = uVar21 >> uVar91;
        uVar34 = auVar66._2_2_;
        auVar116._2_2_ = uVar34 >> uVar91;
        uVar36 = auVar66._4_2_;
        auVar116._4_2_ = uVar36 >> uVar91;
        uVar38 = auVar66._6_2_;
        auVar116._6_2_ = uVar38 >> uVar91;
        uVar40 = auVar66._8_2_;
        auVar116._8_2_ = uVar40 >> uVar91;
        uVar42 = auVar66._10_2_;
        auVar116._10_2_ = uVar42 >> uVar91;
        uVar44 = auVar66._12_2_;
        uVar46 = auVar66._14_2_;
        auVar116._12_2_ = uVar44 >> uVar91;
        auVar116._14_2_ = uVar46 >> uVar91;
        auVar25 = pabsw(auVar25,auVar176);
        uVar89 = auVar25._0_2_;
        auVar191._0_2_ = uVar89 >> uVar91;
        uVar95 = auVar25._2_2_;
        auVar191._2_2_ = uVar95 >> uVar91;
        uVar97 = auVar25._4_2_;
        auVar191._4_2_ = uVar97 >> uVar91;
        uVar99 = auVar25._6_2_;
        auVar191._6_2_ = uVar99 >> uVar91;
        uVar101 = auVar25._8_2_;
        auVar191._8_2_ = uVar101 >> uVar91;
        uVar103 = auVar25._10_2_;
        auVar191._10_2_ = uVar103 >> uVar91;
        uVar105 = auVar25._12_2_;
        uVar106 = auVar25._14_2_;
        auVar191._12_2_ = uVar105 >> uVar91;
        auVar191._14_2_ = uVar106 >> uVar91;
        auVar79 = psraw(auVar176,0xf);
        auVar66 = psubusw(auVar26,auVar116);
        auVar25 = psubusw(auVar26,auVar191);
        sVar65 = auVar66._0_2_;
        sVar72 = auVar66._2_2_;
        sVar73 = auVar66._4_2_;
        sVar74 = auVar66._6_2_;
        sVar75 = auVar66._8_2_;
        sVar76 = auVar66._10_2_;
        sVar77 = auVar66._12_2_;
        sVar78 = auVar66._14_2_;
        sVar48 = auVar25._0_2_;
        sVar51 = auVar25._2_2_;
        sVar53 = auVar25._4_2_;
        sVar55 = auVar25._6_2_;
        sVar57 = auVar25._8_2_;
        sVar59 = auVar25._10_2_;
        sVar61 = auVar25._12_2_;
        sVar63 = auVar25._14_2_;
        auVar123._0_2_ =
             (((short)uVar21 < sVar65) * uVar21 | (ushort)((short)uVar21 >= sVar65) * sVar65) +
             auVar50._0_2_;
        auVar123._2_2_ =
             (((short)uVar34 < sVar72) * uVar34 | (ushort)((short)uVar34 >= sVar72) * sVar72) +
             auVar50._2_2_;
        auVar123._4_2_ =
             (((short)uVar36 < sVar73) * uVar36 | (ushort)((short)uVar36 >= sVar73) * sVar73) +
             auVar50._4_2_;
        auVar123._6_2_ =
             (((short)uVar38 < sVar74) * uVar38 | (ushort)((short)uVar38 >= sVar74) * sVar74) +
             auVar50._6_2_;
        auVar123._8_2_ =
             (((short)uVar40 < sVar75) * uVar40 | (ushort)((short)uVar40 >= sVar75) * sVar75) +
             auVar50._8_2_;
        auVar123._10_2_ =
             (((short)uVar42 < sVar76) * uVar42 | (ushort)((short)uVar42 >= sVar76) * sVar76) +
             auVar50._10_2_;
        auVar123._12_2_ =
             (((short)uVar44 < sVar77) * uVar44 | (ushort)((short)uVar44 >= sVar77) * sVar77) +
             auVar50._12_2_;
        auVar123._14_2_ =
             (((short)uVar46 < sVar78) * uVar46 | (ushort)((short)uVar46 >= sVar78) * sVar78) +
             auVar50._14_2_;
        auVar117._0_2_ =
             (((short)uVar89 < sVar48) * uVar89 | (ushort)((short)uVar89 >= sVar48) * sVar48) +
             auVar79._0_2_;
        auVar117._2_2_ =
             (((short)uVar95 < sVar51) * uVar95 | (ushort)((short)uVar95 >= sVar51) * sVar51) +
             auVar79._2_2_;
        auVar117._4_2_ =
             (((short)uVar97 < sVar53) * uVar97 | (ushort)((short)uVar97 >= sVar53) * sVar53) +
             auVar79._4_2_;
        auVar117._6_2_ =
             (((short)uVar99 < sVar55) * uVar99 | (ushort)((short)uVar99 >= sVar55) * sVar55) +
             auVar79._6_2_;
        auVar117._8_2_ =
             (((short)uVar101 < sVar57) * uVar101 | (ushort)((short)uVar101 >= sVar57) * sVar57) +
             auVar79._8_2_;
        auVar117._10_2_ =
             (((short)uVar103 < sVar59) * uVar103 | (ushort)((short)uVar103 >= sVar59) * sVar59) +
             auVar79._10_2_;
        auVar117._12_2_ =
             (((short)uVar105 < sVar61) * uVar105 | (ushort)((short)uVar105 >= sVar61) * sVar61) +
             auVar79._12_2_;
        auVar117._14_2_ =
             (((short)uVar106 < sVar63) * uVar106 | (ushort)((short)uVar106 >= sVar63) * sVar63) +
             auVar79._14_2_;
        auVar123 = auVar123 ^ auVar50;
        auVar117 = auVar117 ^ auVar79;
        uVar3 = *(undefined8 *)(in + lVar15);
        uVar4 = *(undefined8 *)(in + lVar15 + 0x90);
        uVar90 = *(ulong *)(in + lVar15 + 0x120);
        auVar50._8_8_ = 0;
        auVar50._0_8_ = uVar90;
        uVar5 = *(undefined8 *)(in + lVar15 + 0x1b0);
        auVar170._0_2_ = (short)uVar4 - sVar22;
        auVar170._2_2_ = (short)((ulong)uVar4 >> 0x10) - sVar35;
        auVar170._4_2_ = (short)((ulong)uVar4 >> 0x20) - sVar37;
        auVar170._6_2_ = (short)((ulong)uVar4 >> 0x30) - sVar39;
        auVar170._8_2_ = (short)uVar3 - sVar41;
        auVar170._10_2_ = (short)((ulong)uVar3 >> 0x10) - sVar43;
        auVar170._12_2_ = (short)((ulong)uVar3 >> 0x20) - sVar45;
        auVar170._14_2_ = (short)((ulong)uVar3 >> 0x30) - sVar47;
        auVar130._0_2_ = (short)uVar5 - sVar49;
        auVar130._2_2_ = (short)((ulong)uVar5 >> 0x10) - sVar52;
        auVar130._4_2_ = (short)((ulong)uVar5 >> 0x20) - sVar54;
        auVar130._6_2_ = (short)((ulong)uVar5 >> 0x30) - sVar56;
        auVar130._8_2_ = (short)uVar90 - sVar58;
        auVar130._10_2_ = (short)(uVar90 >> 0x10) - sVar60;
        auVar130._12_2_ = (short)(uVar90 >> 0x20) - sVar62;
        auVar130._14_2_ = (short)(uVar90 >> 0x30) - sVar64;
        auVar25 = pabsw(auVar50,auVar170);
        auVar50 = psraw(auVar170,0xf);
        uVar21 = auVar25._0_2_;
        auVar137._0_2_ = uVar21 >> uVar91;
        uVar34 = auVar25._2_2_;
        auVar137._2_2_ = uVar34 >> uVar91;
        uVar36 = auVar25._4_2_;
        auVar137._4_2_ = uVar36 >> uVar91;
        uVar38 = auVar25._6_2_;
        auVar137._6_2_ = uVar38 >> uVar91;
        uVar40 = auVar25._8_2_;
        auVar137._8_2_ = uVar40 >> uVar91;
        uVar42 = auVar25._10_2_;
        auVar137._10_2_ = uVar42 >> uVar91;
        uVar44 = auVar25._12_2_;
        uVar46 = auVar25._14_2_;
        auVar137._12_2_ = uVar44 >> uVar91;
        auVar137._14_2_ = uVar46 >> uVar91;
        auVar25 = pabsw(auVar79,auVar130);
        uVar89 = auVar25._0_2_;
        auVar185._0_2_ = uVar89 >> uVar91;
        uVar95 = auVar25._2_2_;
        auVar185._2_2_ = uVar95 >> uVar91;
        uVar97 = auVar25._4_2_;
        auVar185._4_2_ = uVar97 >> uVar91;
        uVar99 = auVar25._6_2_;
        auVar185._6_2_ = uVar99 >> uVar91;
        uVar101 = auVar25._8_2_;
        auVar185._8_2_ = uVar101 >> uVar91;
        uVar103 = auVar25._10_2_;
        auVar185._10_2_ = uVar103 >> uVar91;
        uVar105 = auVar25._12_2_;
        uVar106 = auVar25._14_2_;
        auVar185._12_2_ = uVar105 >> uVar91;
        auVar185._14_2_ = uVar106 >> uVar91;
        auVar25 = psraw(auVar130,0xf);
        auVar79 = psubusw(auVar26,auVar137);
        auVar66 = psubusw(auVar26,auVar185);
        sVar65 = auVar79._0_2_;
        sVar72 = auVar79._2_2_;
        sVar73 = auVar79._4_2_;
        sVar74 = auVar79._6_2_;
        sVar75 = auVar79._8_2_;
        sVar76 = auVar79._10_2_;
        sVar77 = auVar79._12_2_;
        sVar78 = auVar79._14_2_;
        sVar48 = auVar66._0_2_;
        sVar51 = auVar66._2_2_;
        sVar53 = auVar66._4_2_;
        sVar55 = auVar66._6_2_;
        sVar57 = auVar66._8_2_;
        sVar59 = auVar66._10_2_;
        sVar61 = auVar66._12_2_;
        sVar63 = auVar66._14_2_;
        auVar165._0_2_ =
             (((short)uVar21 < sVar65) * uVar21 | (ushort)((short)uVar21 >= sVar65) * sVar65) +
             auVar50._0_2_;
        auVar165._2_2_ =
             (((short)uVar34 < sVar72) * uVar34 | (ushort)((short)uVar34 >= sVar72) * sVar72) +
             auVar50._2_2_;
        auVar165._4_2_ =
             (((short)uVar36 < sVar73) * uVar36 | (ushort)((short)uVar36 >= sVar73) * sVar73) +
             auVar50._4_2_;
        auVar165._6_2_ =
             (((short)uVar38 < sVar74) * uVar38 | (ushort)((short)uVar38 >= sVar74) * sVar74) +
             auVar50._6_2_;
        auVar165._8_2_ =
             (((short)uVar40 < sVar75) * uVar40 | (ushort)((short)uVar40 >= sVar75) * sVar75) +
             auVar50._8_2_;
        auVar165._10_2_ =
             (((short)uVar42 < sVar76) * uVar42 | (ushort)((short)uVar42 >= sVar76) * sVar76) +
             auVar50._10_2_;
        auVar165._12_2_ =
             (((short)uVar44 < sVar77) * uVar44 | (ushort)((short)uVar44 >= sVar77) * sVar77) +
             auVar50._12_2_;
        auVar165._14_2_ =
             (((short)uVar46 < sVar78) * uVar46 | (ushort)((short)uVar46 >= sVar78) * sVar78) +
             auVar50._14_2_;
        auVar151._0_2_ =
             (((short)uVar89 < sVar48) * uVar89 | (ushort)((short)uVar89 >= sVar48) * sVar48) +
             auVar25._0_2_;
        auVar151._2_2_ =
             (((short)uVar95 < sVar51) * uVar95 | (ushort)((short)uVar95 >= sVar51) * sVar51) +
             auVar25._2_2_;
        auVar151._4_2_ =
             (((short)uVar97 < sVar53) * uVar97 | (ushort)((short)uVar97 >= sVar53) * sVar53) +
             auVar25._4_2_;
        auVar151._6_2_ =
             (((short)uVar99 < sVar55) * uVar99 | (ushort)((short)uVar99 >= sVar55) * sVar55) +
             auVar25._6_2_;
        auVar151._8_2_ =
             (((short)uVar101 < sVar57) * uVar101 | (ushort)((short)uVar101 >= sVar57) * sVar57) +
             auVar25._8_2_;
        auVar151._10_2_ =
             (((short)uVar103 < sVar59) * uVar103 | (ushort)((short)uVar103 >= sVar59) * sVar59) +
             auVar25._10_2_;
        auVar151._12_2_ =
             (((short)uVar105 < sVar61) * uVar105 | (ushort)((short)uVar105 >= sVar61) * sVar61) +
             auVar25._12_2_;
        auVar151._14_2_ =
             (((short)uVar106 < sVar63) * uVar106 | (ushort)((short)uVar106 >= sVar63) * sVar63) +
             auVar25._14_2_;
        auVar165 = auVar165 ^ auVar50;
        auVar151 = auVar151 ^ auVar25;
        uVar3 = *(undefined8 *)(in + -lVar15);
        uVar4 = *(undefined8 *)(in + (0x90 - lVar15));
        uVar90 = *(ulong *)(in + (0x120 - lVar15));
        auVar66._8_8_ = 0;
        auVar66._0_8_ = uVar90;
        uVar5 = *(undefined8 *)(in + (0x1b0 - lVar15));
        auVar180._0_2_ = (short)uVar4 - sVar22;
        auVar180._2_2_ = (short)((ulong)uVar4 >> 0x10) - sVar35;
        auVar180._4_2_ = (short)((ulong)uVar4 >> 0x20) - sVar37;
        auVar180._6_2_ = (short)((ulong)uVar4 >> 0x30) - sVar39;
        auVar180._8_2_ = (short)uVar3 - sVar41;
        auVar180._10_2_ = (short)((ulong)uVar3 >> 0x10) - sVar43;
        auVar180._12_2_ = (short)((ulong)uVar3 >> 0x20) - sVar45;
        auVar180._14_2_ = (short)((ulong)uVar3 >> 0x30) - sVar47;
        auVar177._0_2_ = (short)uVar5 - sVar49;
        auVar177._2_2_ = (short)((ulong)uVar5 >> 0x10) - sVar52;
        auVar177._4_2_ = (short)((ulong)uVar5 >> 0x20) - sVar54;
        auVar177._6_2_ = (short)((ulong)uVar5 >> 0x30) - sVar56;
        auVar177._8_2_ = (short)uVar90 - sVar58;
        auVar177._10_2_ = (short)(uVar90 >> 0x10) - sVar60;
        auVar177._12_2_ = (short)(uVar90 >> 0x20) - sVar62;
        auVar177._14_2_ = (short)(uVar90 >> 0x30) - sVar64;
        auVar25 = pabsw(auVar66,auVar180);
        auVar50 = psraw(auVar180,0xf);
        uVar21 = auVar25._0_2_;
        auVar131._0_2_ = uVar21 >> uVar91;
        uVar34 = auVar25._2_2_;
        auVar131._2_2_ = uVar34 >> uVar91;
        uVar36 = auVar25._4_2_;
        auVar131._4_2_ = uVar36 >> uVar91;
        uVar38 = auVar25._6_2_;
        auVar131._6_2_ = uVar38 >> uVar91;
        uVar40 = auVar25._8_2_;
        auVar131._8_2_ = uVar40 >> uVar91;
        uVar42 = auVar25._10_2_;
        auVar131._10_2_ = uVar42 >> uVar91;
        uVar44 = auVar25._12_2_;
        uVar46 = auVar25._14_2_;
        auVar131._12_2_ = uVar44 >> uVar91;
        auVar131._14_2_ = uVar46 >> uVar91;
        auVar25 = pabsw(auVar185,auVar177);
        uVar89 = auVar25._0_2_;
        auVar192._0_2_ = uVar89 >> uVar91;
        uVar95 = auVar25._2_2_;
        auVar192._2_2_ = uVar95 >> uVar91;
        uVar97 = auVar25._4_2_;
        auVar192._4_2_ = uVar97 >> uVar91;
        uVar99 = auVar25._6_2_;
        auVar192._6_2_ = uVar99 >> uVar91;
        uVar101 = auVar25._8_2_;
        auVar192._8_2_ = uVar101 >> uVar91;
        uVar103 = auVar25._10_2_;
        auVar192._10_2_ = uVar103 >> uVar91;
        uVar105 = auVar25._12_2_;
        uVar106 = auVar25._14_2_;
        auVar192._12_2_ = uVar105 >> uVar91;
        auVar192._14_2_ = uVar106 >> uVar91;
        auVar79 = psraw(auVar177,0xf);
        auVar66 = psubusw(auVar26,auVar131);
        auVar25 = psubusw(auVar26,auVar192);
        sVar65 = auVar66._0_2_;
        sVar72 = auVar66._2_2_;
        sVar73 = auVar66._4_2_;
        sVar74 = auVar66._6_2_;
        sVar75 = auVar66._8_2_;
        sVar76 = auVar66._10_2_;
        sVar77 = auVar66._12_2_;
        sVar78 = auVar66._14_2_;
        sVar48 = auVar25._0_2_;
        sVar51 = auVar25._2_2_;
        sVar53 = auVar25._4_2_;
        sVar55 = auVar25._6_2_;
        sVar57 = auVar25._8_2_;
        sVar59 = auVar25._10_2_;
        sVar61 = auVar25._12_2_;
        sVar63 = auVar25._14_2_;
        auVar138._0_2_ =
             (((short)uVar21 < sVar65) * uVar21 | (ushort)((short)uVar21 >= sVar65) * sVar65) +
             auVar50._0_2_;
        auVar138._2_2_ =
             (((short)uVar34 < sVar72) * uVar34 | (ushort)((short)uVar34 >= sVar72) * sVar72) +
             auVar50._2_2_;
        auVar138._4_2_ =
             (((short)uVar36 < sVar73) * uVar36 | (ushort)((short)uVar36 >= sVar73) * sVar73) +
             auVar50._4_2_;
        auVar138._6_2_ =
             (((short)uVar38 < sVar74) * uVar38 | (ushort)((short)uVar38 >= sVar74) * sVar74) +
             auVar50._6_2_;
        auVar138._8_2_ =
             (((short)uVar40 < sVar75) * uVar40 | (ushort)((short)uVar40 >= sVar75) * sVar75) +
             auVar50._8_2_;
        auVar138._10_2_ =
             (((short)uVar42 < sVar76) * uVar42 | (ushort)((short)uVar42 >= sVar76) * sVar76) +
             auVar50._10_2_;
        auVar138._12_2_ =
             (((short)uVar44 < sVar77) * uVar44 | (ushort)((short)uVar44 >= sVar77) * sVar77) +
             auVar50._12_2_;
        auVar138._14_2_ =
             (((short)uVar46 < sVar78) * uVar46 | (ushort)((short)uVar46 >= sVar78) * sVar78) +
             auVar50._14_2_;
        auVar132._0_2_ =
             (((short)uVar89 < sVar48) * uVar89 | (ushort)((short)uVar89 >= sVar48) * sVar48) +
             auVar79._0_2_;
        auVar132._2_2_ =
             (((short)uVar95 < sVar51) * uVar95 | (ushort)((short)uVar95 >= sVar51) * sVar51) +
             auVar79._2_2_;
        auVar132._4_2_ =
             (((short)uVar97 < sVar53) * uVar97 | (ushort)((short)uVar97 >= sVar53) * sVar53) +
             auVar79._4_2_;
        auVar132._6_2_ =
             (((short)uVar99 < sVar55) * uVar99 | (ushort)((short)uVar99 >= sVar55) * sVar55) +
             auVar79._6_2_;
        auVar132._8_2_ =
             (((short)uVar101 < sVar57) * uVar101 | (ushort)((short)uVar101 >= sVar57) * sVar57) +
             auVar79._8_2_;
        auVar132._10_2_ =
             (((short)uVar103 < sVar59) * uVar103 | (ushort)((short)uVar103 >= sVar59) * sVar59) +
             auVar79._10_2_;
        auVar132._12_2_ =
             (((short)uVar105 < sVar61) * uVar105 | (ushort)((short)uVar105 >= sVar61) * sVar61) +
             auVar79._12_2_;
        auVar132._14_2_ =
             (((short)uVar106 < sVar63) * uVar106 | (ushort)((short)uVar106 >= sVar63) * sVar63) +
             auVar79._14_2_;
        auVar138 = auVar138 ^ auVar50;
        in_XMM10._0_2_ = auVar138._0_2_ + auVar165._0_2_;
        in_XMM10._2_2_ = auVar138._2_2_ + auVar165._2_2_;
        in_XMM10._4_2_ = auVar138._4_2_ + auVar165._4_2_;
        in_XMM10._6_2_ = auVar138._6_2_ + auVar165._6_2_;
        in_XMM10._8_2_ = auVar138._8_2_ + auVar165._8_2_;
        in_XMM10._10_2_ = auVar138._10_2_ + auVar165._10_2_;
        in_XMM10._12_2_ = auVar138._12_2_ + auVar165._12_2_;
        in_XMM10._14_2_ = auVar138._14_2_ + auVar165._14_2_;
        auVar132 = auVar132 ^ auVar79;
        uVar3 = *(undefined8 *)(in + lVar20);
        uVar4 = *(undefined8 *)(in + lVar20 + 0x90);
        uVar90 = *(ulong *)(in + lVar20 + 0x120);
        auVar79._8_8_ = 0;
        auVar79._0_8_ = uVar90;
        uVar5 = *(undefined8 *)(in + lVar20 + 0x1b0);
        auVar86._0_2_ = (short)uVar4 - sVar22;
        auVar86._2_2_ = (short)((ulong)uVar4 >> 0x10) - sVar35;
        auVar86._4_2_ = (short)((ulong)uVar4 >> 0x20) - sVar37;
        auVar86._6_2_ = (short)((ulong)uVar4 >> 0x30) - sVar39;
        auVar86._8_2_ = (short)uVar3 - sVar41;
        auVar86._10_2_ = (short)((ulong)uVar3 >> 0x10) - sVar43;
        auVar86._12_2_ = (short)((ulong)uVar3 >> 0x20) - sVar45;
        auVar86._14_2_ = (short)((ulong)uVar3 >> 0x30) - sVar47;
        auVar152._0_2_ = (short)uVar5 - sVar49;
        auVar152._2_2_ = (short)((ulong)uVar5 >> 0x10) - sVar52;
        auVar152._4_2_ = (short)((ulong)uVar5 >> 0x20) - sVar54;
        auVar152._6_2_ = (short)((ulong)uVar5 >> 0x30) - sVar56;
        auVar152._8_2_ = (short)uVar90 - sVar58;
        auVar152._10_2_ = (short)(uVar90 >> 0x10) - sVar60;
        auVar152._12_2_ = (short)(uVar90 >> 0x20) - sVar62;
        auVar152._14_2_ = (short)(uVar90 >> 0x30) - sVar64;
        auVar25 = pabsw(auVar79,auVar86);
        auVar50 = psraw(auVar86,0xf);
        auVar79 = pabsw(auVar165,auVar152);
        auVar66 = psraw(auVar152,0xf);
        uVar21 = auVar25._0_2_;
        auVar178._0_2_ = uVar21 >> uVar91;
        uVar34 = auVar25._2_2_;
        auVar178._2_2_ = uVar34 >> uVar91;
        uVar36 = auVar25._4_2_;
        auVar178._4_2_ = uVar36 >> uVar91;
        uVar38 = auVar25._6_2_;
        auVar178._6_2_ = uVar38 >> uVar91;
        uVar40 = auVar25._8_2_;
        auVar178._8_2_ = uVar40 >> uVar91;
        uVar42 = auVar25._10_2_;
        auVar178._10_2_ = uVar42 >> uVar91;
        uVar44 = auVar25._12_2_;
        uVar46 = auVar25._14_2_;
        auVar178._12_2_ = uVar44 >> uVar91;
        auVar178._14_2_ = uVar46 >> uVar91;
        uVar89 = auVar79._0_2_;
        auVar193._0_2_ = uVar89 >> uVar91;
        uVar95 = auVar79._2_2_;
        auVar193._2_2_ = uVar95 >> uVar91;
        uVar97 = auVar79._4_2_;
        auVar193._4_2_ = uVar97 >> uVar91;
        uVar99 = auVar79._6_2_;
        auVar193._6_2_ = uVar99 >> uVar91;
        uVar101 = auVar79._8_2_;
        auVar193._8_2_ = uVar101 >> uVar91;
        uVar103 = auVar79._10_2_;
        auVar193._10_2_ = uVar103 >> uVar91;
        uVar105 = auVar79._12_2_;
        uVar106 = auVar79._14_2_;
        auVar193._12_2_ = uVar105 >> uVar91;
        auVar193._14_2_ = uVar106 >> uVar91;
        auVar79 = psubusw(auVar26,auVar178);
        auVar25 = psubusw(auVar26,auVar193);
        sVar65 = auVar79._0_2_;
        sVar72 = auVar79._2_2_;
        sVar73 = auVar79._4_2_;
        sVar74 = auVar79._6_2_;
        sVar75 = auVar79._8_2_;
        sVar76 = auVar79._10_2_;
        sVar77 = auVar79._12_2_;
        sVar78 = auVar79._14_2_;
        sVar48 = auVar25._0_2_;
        sVar51 = auVar25._2_2_;
        sVar53 = auVar25._4_2_;
        sVar55 = auVar25._6_2_;
        sVar57 = auVar25._8_2_;
        sVar59 = auVar25._10_2_;
        sVar61 = auVar25._12_2_;
        sVar63 = auVar25._14_2_;
        auVar186._0_2_ =
             (((short)uVar21 < sVar65) * uVar21 | (ushort)((short)uVar21 >= sVar65) * sVar65) +
             auVar50._0_2_;
        auVar186._2_2_ =
             (((short)uVar34 < sVar72) * uVar34 | (ushort)((short)uVar34 >= sVar72) * sVar72) +
             auVar50._2_2_;
        auVar186._4_2_ =
             (((short)uVar36 < sVar73) * uVar36 | (ushort)((short)uVar36 >= sVar73) * sVar73) +
             auVar50._4_2_;
        auVar186._6_2_ =
             (((short)uVar38 < sVar74) * uVar38 | (ushort)((short)uVar38 >= sVar74) * sVar74) +
             auVar50._6_2_;
        auVar186._8_2_ =
             (((short)uVar40 < sVar75) * uVar40 | (ushort)((short)uVar40 >= sVar75) * sVar75) +
             auVar50._8_2_;
        auVar186._10_2_ =
             (((short)uVar42 < sVar76) * uVar42 | (ushort)((short)uVar42 >= sVar76) * sVar76) +
             auVar50._10_2_;
        auVar186._12_2_ =
             (((short)uVar44 < sVar77) * uVar44 | (ushort)((short)uVar44 >= sVar77) * sVar77) +
             auVar50._12_2_;
        auVar186._14_2_ =
             (((short)uVar46 < sVar78) * uVar46 | (ushort)((short)uVar46 >= sVar78) * sVar78) +
             auVar50._14_2_;
        auVar179._0_2_ =
             (((short)uVar89 < sVar48) * uVar89 | (ushort)((short)uVar89 >= sVar48) * sVar48) +
             auVar66._0_2_;
        auVar179._2_2_ =
             (((short)uVar95 < sVar51) * uVar95 | (ushort)((short)uVar95 >= sVar51) * sVar51) +
             auVar66._2_2_;
        auVar179._4_2_ =
             (((short)uVar97 < sVar53) * uVar97 | (ushort)((short)uVar97 >= sVar53) * sVar53) +
             auVar66._4_2_;
        auVar179._6_2_ =
             (((short)uVar99 < sVar55) * uVar99 | (ushort)((short)uVar99 >= sVar55) * sVar55) +
             auVar66._6_2_;
        auVar179._8_2_ =
             (((short)uVar101 < sVar57) * uVar101 | (ushort)((short)uVar101 >= sVar57) * sVar57) +
             auVar66._8_2_;
        auVar179._10_2_ =
             (((short)uVar103 < sVar59) * uVar103 | (ushort)((short)uVar103 >= sVar59) * sVar59) +
             auVar66._10_2_;
        auVar179._12_2_ =
             (((short)uVar105 < sVar61) * uVar105 | (ushort)((short)uVar105 >= sVar61) * sVar61) +
             auVar66._12_2_;
        auVar179._14_2_ =
             (((short)uVar106 < sVar63) * uVar106 | (ushort)((short)uVar106 >= sVar63) * sVar63) +
             auVar66._14_2_;
        auVar186 = auVar186 ^ auVar50;
        uVar3 = *(undefined8 *)(in + -lVar20);
        uVar4 = *(undefined8 *)(in + (0x90 - lVar20));
        uVar90 = *(ulong *)(in + (0x120 - lVar20));
        auVar107._8_8_ = 0;
        auVar107._0_8_ = uVar90;
        uVar5 = *(undefined8 *)(in + (0x1b0 - lVar20));
        auVar87._0_2_ = (short)uVar4 - sVar22;
        auVar87._2_2_ = (short)((ulong)uVar4 >> 0x10) - sVar35;
        auVar87._4_2_ = (short)((ulong)uVar4 >> 0x20) - sVar37;
        auVar87._6_2_ = (short)((ulong)uVar4 >> 0x30) - sVar39;
        auVar87._8_2_ = (short)uVar3 - sVar41;
        auVar87._10_2_ = (short)((ulong)uVar3 >> 0x10) - sVar43;
        auVar87._12_2_ = (short)((ulong)uVar3 >> 0x20) - sVar45;
        auVar87._14_2_ = (short)((ulong)uVar3 >> 0x30) - sVar47;
        auVar194._0_2_ = (short)uVar5 - sVar49;
        auVar194._2_2_ = (short)((ulong)uVar5 >> 0x10) - sVar52;
        auVar194._4_2_ = (short)((ulong)uVar5 >> 0x20) - sVar54;
        auVar194._6_2_ = (short)((ulong)uVar5 >> 0x30) - sVar56;
        auVar194._8_2_ = (short)uVar90 - sVar58;
        auVar194._10_2_ = (short)(uVar90 >> 0x10) - sVar60;
        auVar194._12_2_ = (short)(uVar90 >> 0x20) - sVar62;
        auVar194._14_2_ = (short)(uVar90 >> 0x30) - sVar64;
        auVar25 = pabsw(auVar107,auVar87);
        uVar90 = (ulong)uVar16;
        uVar89 = auVar25._0_2_;
        auVar166._0_2_ = uVar89 >> uVar90;
        uVar95 = auVar25._2_2_;
        auVar166._2_2_ = uVar95 >> uVar90;
        uVar97 = auVar25._4_2_;
        auVar166._4_2_ = uVar97 >> uVar90;
        uVar99 = auVar25._6_2_;
        auVar166._6_2_ = uVar99 >> uVar90;
        uVar101 = auVar25._8_2_;
        auVar166._8_2_ = uVar101 >> uVar90;
        uVar103 = auVar25._10_2_;
        auVar166._10_2_ = uVar103 >> uVar90;
        uVar105 = auVar25._12_2_;
        uVar106 = auVar25._14_2_;
        auVar166._12_2_ = uVar105 >> uVar90;
        auVar166._14_2_ = uVar106 >> uVar90;
        auVar25 = pabsw(auVar156,auVar194);
        uVar21 = auVar25._0_2_;
        auVar109._0_2_ = uVar21 >> uVar90;
        uVar34 = auVar25._2_2_;
        auVar109._2_2_ = uVar34 >> uVar90;
        uVar36 = auVar25._4_2_;
        auVar109._4_2_ = uVar36 >> uVar90;
        uVar38 = auVar25._6_2_;
        auVar109._6_2_ = uVar38 >> uVar90;
        uVar40 = auVar25._8_2_;
        auVar109._8_2_ = uVar40 >> uVar90;
        uVar42 = auVar25._10_2_;
        auVar109._10_2_ = uVar42 >> uVar90;
        uVar44 = auVar25._12_2_;
        uVar46 = auVar25._14_2_;
        auVar109._12_2_ = uVar44 >> uVar90;
        auVar109._14_2_ = uVar46 >> uVar90;
        in_XMM13 = auVar179 ^ auVar66;
        auVar25 = psubusw(auVar26,auVar166);
        auVar156 = psubusw(auVar26,auVar109);
        sVar48 = auVar25._0_2_;
        sVar51 = auVar25._2_2_;
        sVar53 = auVar25._4_2_;
        sVar55 = auVar25._6_2_;
        sVar57 = auVar25._8_2_;
        sVar59 = auVar25._10_2_;
        sVar61 = auVar25._12_2_;
        sVar63 = auVar25._14_2_;
        sVar65 = auVar156._0_2_;
        sVar72 = auVar156._2_2_;
        sVar73 = auVar156._4_2_;
        sVar74 = auVar156._6_2_;
        sVar75 = auVar156._8_2_;
        sVar76 = auVar156._10_2_;
        sVar77 = auVar156._12_2_;
        sVar78 = auVar156._14_2_;
        auVar25 = psraw(auVar87,0xf);
        auVar153._0_2_ =
             (((short)uVar89 < sVar48) * uVar89 | (ushort)((short)uVar89 >= sVar48) * sVar48) +
             auVar25._0_2_;
        auVar153._2_2_ =
             (((short)uVar95 < sVar51) * uVar95 | (ushort)((short)uVar95 >= sVar51) * sVar51) +
             auVar25._2_2_;
        auVar153._4_2_ =
             (((short)uVar97 < sVar53) * uVar97 | (ushort)((short)uVar97 >= sVar53) * sVar53) +
             auVar25._4_2_;
        auVar153._6_2_ =
             (((short)uVar99 < sVar55) * uVar99 | (ushort)((short)uVar99 >= sVar55) * sVar55) +
             auVar25._6_2_;
        auVar153._8_2_ =
             (((short)uVar101 < sVar57) * uVar101 | (ushort)((short)uVar101 >= sVar57) * sVar57) +
             auVar25._8_2_;
        auVar153._10_2_ =
             (((short)uVar103 < sVar59) * uVar103 | (ushort)((short)uVar103 >= sVar59) * sVar59) +
             auVar25._10_2_;
        auVar153._12_2_ =
             (((short)uVar105 < sVar61) * uVar105 | (ushort)((short)uVar105 >= sVar61) * sVar61) +
             auVar25._12_2_;
        auVar153._14_2_ =
             (((short)uVar106 < sVar63) * uVar106 | (ushort)((short)uVar106 >= sVar63) * sVar63) +
             auVar25._14_2_;
        auVar153 = auVar153 ^ auVar25;
        auVar25 = psraw(auVar194,0xf);
        auVar167._0_2_ =
             (((short)uVar21 < sVar65) * uVar21 | (ushort)((short)uVar21 >= sVar65) * sVar65) +
             auVar25._0_2_;
        auVar167._2_2_ =
             (((short)uVar34 < sVar72) * uVar34 | (ushort)((short)uVar34 >= sVar72) * sVar72) +
             auVar25._2_2_;
        auVar167._4_2_ =
             (((short)uVar36 < sVar73) * uVar36 | (ushort)((short)uVar36 >= sVar73) * sVar73) +
             auVar25._4_2_;
        auVar167._6_2_ =
             (((short)uVar38 < sVar74) * uVar38 | (ushort)((short)uVar38 >= sVar74) * sVar74) +
             auVar25._6_2_;
        auVar167._8_2_ =
             (((short)uVar40 < sVar75) * uVar40 | (ushort)((short)uVar40 >= sVar75) * sVar75) +
             auVar25._8_2_;
        auVar167._10_2_ =
             (((short)uVar42 < sVar76) * uVar42 | (ushort)((short)uVar42 >= sVar76) * sVar76) +
             auVar25._10_2_;
        auVar167._12_2_ =
             (((short)uVar44 < sVar77) * uVar44 | (ushort)((short)uVar44 >= sVar77) * sVar77) +
             auVar25._12_2_;
        auVar167._14_2_ =
             (((short)uVar46 < sVar78) * uVar46 | (ushort)((short)uVar46 >= sVar78) * sVar78) +
             auVar25._14_2_;
        auVar167 = auVar167 ^ auVar25;
        local_88 = auVar71._0_2_;
        sStack_86 = auVar71._2_2_;
        auVar25._4_2_ = sStack_94;
        auVar25._0_4_ = auVar139._0_4_;
        auVar25._6_2_ = sStack_92;
        auVar25._8_2_ = sStack_94;
        auVar25._10_2_ = sStack_92;
        auVar25._12_2_ = sStack_94;
        auVar25._14_2_ = sStack_92;
        auVar154._0_2_ =
             (auVar153._0_2_ + auVar186._0_2_ + in_XMM10._0_2_) * sStack_94 +
             (auVar123._0_2_ + auVar164._0_2_ + auVar136._0_2_ + auVar121._0_2_) * local_88;
        auVar154._2_2_ =
             (auVar153._2_2_ + auVar186._2_2_ + in_XMM10._2_2_) * sStack_92 +
             (auVar123._2_2_ + auVar164._2_2_ + auVar136._2_2_ + auVar121._2_2_) * sStack_86;
        auVar154._4_2_ =
             (auVar153._4_2_ + auVar186._4_2_ + in_XMM10._4_2_) * sStack_94 +
             (auVar123._4_2_ + auVar164._4_2_ + auVar136._4_2_ + auVar121._4_2_) * local_88;
        auVar154._6_2_ =
             (auVar153._6_2_ + auVar186._6_2_ + in_XMM10._6_2_) * sStack_92 +
             (auVar123._6_2_ + auVar164._6_2_ + auVar136._6_2_ + auVar121._6_2_) * sStack_86;
        auVar154._8_2_ =
             (auVar153._8_2_ + auVar186._8_2_ + in_XMM10._8_2_) * sStack_94 +
             (auVar123._8_2_ + auVar164._8_2_ + auVar136._8_2_ + auVar121._8_2_) * local_88;
        auVar154._10_2_ =
             (auVar153._10_2_ + auVar186._10_2_ + in_XMM10._10_2_) * sStack_92 +
             (auVar123._10_2_ + auVar164._10_2_ + auVar136._10_2_ + auVar121._10_2_) * sStack_86;
        auVar154._12_2_ =
             (auVar153._12_2_ + auVar186._12_2_ + in_XMM10._12_2_) * sStack_94 +
             (auVar123._12_2_ + auVar164._12_2_ + auVar136._12_2_ + auVar121._12_2_) * local_88;
        auVar154._14_2_ =
             (auVar153._14_2_ + auVar186._14_2_ + in_XMM10._14_2_) * sStack_92 +
             (auVar123._14_2_ + auVar164._14_2_ + auVar136._14_2_ + auVar121._14_2_) * sStack_86;
        auVar168._0_2_ =
             (auVar167._0_2_ + in_XMM13._0_2_ + auVar132._0_2_ + auVar151._0_2_) * sStack_94 +
             (auVar117._0_2_ + auVar150._0_2_ + auVar129._0_2_ + auVar114._0_2_) * local_88;
        auVar168._2_2_ =
             (auVar167._2_2_ + in_XMM13._2_2_ + auVar132._2_2_ + auVar151._2_2_) * sStack_92 +
             (auVar117._2_2_ + auVar150._2_2_ + auVar129._2_2_ + auVar114._2_2_) * sStack_86;
        auVar168._4_2_ =
             (auVar167._4_2_ + in_XMM13._4_2_ + auVar132._4_2_ + auVar151._4_2_) * sStack_94 +
             (auVar117._4_2_ + auVar150._4_2_ + auVar129._4_2_ + auVar114._4_2_) * local_88;
        auVar168._6_2_ =
             (auVar167._6_2_ + in_XMM13._6_2_ + auVar132._6_2_ + auVar151._6_2_) * sStack_92 +
             (auVar117._6_2_ + auVar150._6_2_ + auVar129._6_2_ + auVar114._6_2_) * sStack_86;
        auVar168._8_2_ =
             (auVar167._8_2_ + in_XMM13._8_2_ + auVar132._8_2_ + auVar151._8_2_) * sStack_94 +
             (auVar117._8_2_ + auVar150._8_2_ + auVar129._8_2_ + auVar114._8_2_) * local_88;
        auVar168._10_2_ =
             (auVar167._10_2_ + in_XMM13._10_2_ + auVar132._10_2_ + auVar151._10_2_) * sStack_92 +
             (auVar117._10_2_ + auVar150._10_2_ + auVar129._10_2_ + auVar114._10_2_) * sStack_86;
        auVar168._12_2_ =
             (auVar167._12_2_ + in_XMM13._12_2_ + auVar132._12_2_ + auVar151._12_2_) * sStack_94 +
             (auVar117._12_2_ + auVar150._12_2_ + auVar129._12_2_ + auVar114._12_2_) * local_88;
        auVar168._14_2_ =
             (auVar167._14_2_ + in_XMM13._14_2_ + auVar132._14_2_ + auVar151._14_2_) * sStack_92 +
             (auVar117._14_2_ + auVar150._14_2_ + auVar129._14_2_ + auVar114._14_2_) * sStack_86;
        auVar156 = psraw(auVar154,0xf);
        auVar25 = pmovsxbw(auVar25,0x808080808080808);
        auVar155._0_2_ = auVar154._0_2_ + auVar25._0_2_ + auVar156._0_2_;
        auVar155._2_2_ = auVar154._2_2_ + auVar25._2_2_ + auVar156._2_2_;
        auVar155._4_2_ = auVar154._4_2_ + auVar25._4_2_ + auVar156._4_2_;
        auVar155._6_2_ = auVar154._6_2_ + auVar25._6_2_ + auVar156._6_2_;
        auVar155._8_2_ = auVar154._8_2_ + auVar25._8_2_ + auVar156._8_2_;
        auVar155._10_2_ = auVar154._10_2_ + auVar25._10_2_ + auVar156._10_2_;
        auVar155._12_2_ = auVar154._12_2_ + auVar25._12_2_ + auVar156._12_2_;
        auVar155._14_2_ = auVar154._14_2_ + auVar25._14_2_ + auVar156._14_2_;
        auVar156 = psraw(auVar155,4);
        in_XMM11._0_8_ =
             CONCAT26(auVar156._6_2_ + sVar39,
                      CONCAT24(auVar156._4_2_ + sVar37,
                               CONCAT22(auVar156._2_2_ + sVar35,auVar156._0_2_ + sVar22)));
        in_XMM11._8_2_ = auVar156._8_2_ + sVar41;
        in_XMM11._10_2_ = auVar156._10_2_ + sVar43;
        in_XMM11._12_2_ = auVar156._12_2_ + sVar45;
        in_XMM11._14_2_ = auVar156._14_2_ + sVar47;
        auVar156 = psraw(auVar168,0xf);
        *(long *)dest = in_XMM11._8_8_;
        auVar169._0_2_ = auVar168._0_2_ + auVar25._0_2_ + auVar156._0_2_;
        auVar169._2_2_ = auVar168._2_2_ + auVar25._2_2_ + auVar156._2_2_;
        auVar169._4_2_ = auVar168._4_2_ + auVar25._4_2_ + auVar156._4_2_;
        auVar169._6_2_ = auVar168._6_2_ + auVar25._6_2_ + auVar156._6_2_;
        auVar169._8_2_ = auVar168._8_2_ + auVar25._8_2_ + auVar156._8_2_;
        auVar169._10_2_ = auVar168._10_2_ + auVar25._10_2_ + auVar156._10_2_;
        auVar169._12_2_ = auVar168._12_2_ + auVar25._12_2_ + auVar156._12_2_;
        auVar169._14_2_ = auVar168._14_2_ + auVar25._14_2_ + auVar156._14_2_;
        auVar156 = psraw(auVar169,4);
        *(undefined8 *)((long)dest + lVar17 * 2) = in_XMM11._0_8_;
        *(short *)((long)dest + lVar17 * 4 + 8) = auVar156._8_2_ + sVar58;
        *(short *)((long)dest + lVar17 * 4 + 10) = auVar156._10_2_ + sVar60;
        *(short *)((long)dest + lVar17 * 4 + 0xc) = auVar156._12_2_ + sVar62;
        *(short *)((long)dest + lVar17 * 4 + 0xe) = auVar156._14_2_ + sVar64;
        psVar2 = (short *)((long)dest + lVar17 * 6);
        *psVar2 = auVar156._0_2_ + sVar49;
        psVar2[1] = auVar156._2_2_ + sVar52;
        psVar2[2] = auVar156._4_2_ + sVar54;
        psVar2[3] = auVar156._6_2_ + sVar56;
        uVar19 = uVar19 + 4;
        in = in + 0x240;
        dest = (void *)((long)dest + lVar17 * 8);
      } while (uVar19 < (uint)block_height);
    }
  }
  return;
}

Assistant:

void SIMD_FUNC(cdef_filter_16_2)(void *dest, int dstride, const uint16_t *in,
                                 int pri_strength, int sec_strength, int dir,
                                 int pri_damping, int sec_damping,
                                 int coeff_shift, int block_width,
                                 int block_height) {
  if (block_width == 8) {
    filter_block_8x8(/*is_lowbd=*/0, dest, dstride, in, pri_strength,
                     sec_strength, dir, pri_damping, sec_damping, coeff_shift,
                     block_height, /*enable_primary=*/0,
                     /*enable_secondary=*/1);
  } else {
    filter_block_4x4(/*is_lowbd=*/0, dest, dstride, in, pri_strength,
                     sec_strength, dir, pri_damping, sec_damping, coeff_shift,
                     block_height, /*enable_primary=*/0,
                     /*enable_secondary=*/1);
  }
}